

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  byte bVar50;
  byte bVar51;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar52;
  byte bVar53;
  ulong uVar54;
  byte bVar55;
  ulong uVar56;
  undefined8 unaff_R13;
  bool bVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar123;
  uint uVar124;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  uint uVar125;
  uint uVar129;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar149;
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar150;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar163 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar209;
  float fVar210;
  vint4 ai_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar211;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [32];
  float fVar215;
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  vint4 ai;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [32];
  undefined1 auVar224 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  float fVar234;
  vint4 ai_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar233 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  float fVar251;
  undefined1 auVar246 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  float fVar250;
  undefined1 auVar247 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  float s;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a28;
  undefined1 local_8b0 [16];
  ulong local_898;
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  Primitive *local_7a0;
  ulong local_798;
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar117 [32];
  undefined1 auVar120 [32];
  undefined1 auVar248 [64];
  
  uVar58 = (ulong)(byte)prim[1];
  fVar215 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar66 = vsubps_avx(auVar66,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  auVar191._0_4_ = fVar215 * auVar66._0_4_;
  auVar191._4_4_ = fVar215 * auVar66._4_4_;
  auVar191._8_4_ = fVar215 * auVar66._8_4_;
  auVar191._12_4_ = fVar215 * auVar66._12_4_;
  auVar130._0_4_ = fVar215 * auVar65._0_4_;
  auVar130._4_4_ = fVar215 * auVar65._4_4_;
  auVar130._8_4_ = fVar215 * auVar65._8_4_;
  auVar130._12_4_ = fVar215 * auVar65._12_4_;
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xd + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x12 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x13 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x14 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar259._4_4_ = auVar130._0_4_;
  auVar259._0_4_ = auVar130._0_4_;
  auVar259._8_4_ = auVar130._0_4_;
  auVar259._12_4_ = auVar130._0_4_;
  auVar11 = vshufps_avx(auVar130,auVar130,0x55);
  auVar70 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar215 = auVar70._0_4_;
  auVar216._0_4_ = fVar215 * auVar60._0_4_;
  fVar149 = auVar70._4_4_;
  auVar216._4_4_ = fVar149 * auVar60._4_4_;
  fVar190 = auVar70._8_4_;
  auVar216._8_4_ = fVar190 * auVar60._8_4_;
  fVar209 = auVar70._12_4_;
  auVar216._12_4_ = fVar209 * auVar60._12_4_;
  auVar151._0_4_ = auVar61._0_4_ * fVar215;
  auVar151._4_4_ = auVar61._4_4_ * fVar149;
  auVar151._8_4_ = auVar61._8_4_ * fVar190;
  auVar151._12_4_ = auVar61._12_4_ * fVar209;
  auVar131._0_4_ = auVar62._0_4_ * fVar215;
  auVar131._4_4_ = auVar62._4_4_ * fVar149;
  auVar131._8_4_ = auVar62._8_4_ * fVar190;
  auVar131._12_4_ = auVar62._12_4_ * fVar209;
  auVar70 = vfmadd231ps_fma(auVar216,auVar11,auVar65);
  auVar64 = vfmadd231ps_fma(auVar151,auVar11,auVar67);
  auVar11 = vfmadd231ps_fma(auVar131,auVar69,auVar11);
  auVar63 = vfmadd231ps_fma(auVar70,auVar259,auVar66);
  auVar64 = vfmadd231ps_fma(auVar64,auVar259,auVar10);
  auVar130 = vfmadd231ps_fma(auVar11,auVar68,auVar259);
  auVar260._4_4_ = auVar191._0_4_;
  auVar260._0_4_ = auVar191._0_4_;
  auVar260._8_4_ = auVar191._0_4_;
  auVar260._12_4_ = auVar191._0_4_;
  auVar11 = vshufps_avx(auVar191,auVar191,0x55);
  auVar70 = vshufps_avx(auVar191,auVar191,0xaa);
  auVar60 = vmulps_avx512vl(auVar70,auVar60);
  auVar192._0_4_ = auVar70._0_4_ * auVar61._0_4_;
  auVar192._4_4_ = auVar70._4_4_ * auVar61._4_4_;
  auVar192._8_4_ = auVar70._8_4_ * auVar61._8_4_;
  auVar192._12_4_ = auVar70._12_4_ * auVar61._12_4_;
  auVar170._0_4_ = auVar70._0_4_ * auVar62._0_4_;
  auVar170._4_4_ = auVar70._4_4_ * auVar62._4_4_;
  auVar170._8_4_ = auVar70._8_4_ * auVar62._8_4_;
  auVar170._12_4_ = auVar70._12_4_ * auVar62._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar60,auVar11,auVar65);
  auVar65 = vfmadd231ps_fma(auVar192,auVar11,auVar67);
  auVar60 = vfmadd231ps_fma(auVar170,auVar11,auVar69);
  auVar62 = vfmadd231ps_avx512vl(auVar61,auVar260,auVar66);
  auVar61 = vfmadd231ps_fma(auVar65,auVar260,auVar10);
  auVar69 = vfmadd231ps_fma(auVar60,auVar260,auVar68);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar66 = vandps_avx(auVar63,auVar238);
  auVar228._8_4_ = 0x219392ef;
  auVar228._0_8_ = 0x219392ef219392ef;
  auVar228._12_4_ = 0x219392ef;
  uVar54 = vcmpps_avx512vl(auVar66,auVar228,1);
  bVar57 = (bool)((byte)uVar54 & 1);
  auVar70._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._0_4_;
  bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._4_4_;
  bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._8_4_;
  bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._12_4_;
  auVar66 = vandps_avx(auVar64,auVar238);
  uVar54 = vcmpps_avx512vl(auVar66,auVar228,1);
  bVar57 = (bool)((byte)uVar54 & 1);
  auVar63._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._0_4_;
  bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._4_4_;
  bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._8_4_;
  bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._12_4_;
  auVar66 = vandps_avx(auVar130,auVar238);
  uVar54 = vcmpps_avx512vl(auVar66,auVar228,1);
  bVar57 = (bool)((byte)uVar54 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar130._0_4_;
  bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar130._4_4_;
  bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar130._8_4_;
  bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar130._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar70);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = 0x3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar70,auVar65,auVar229);
  auVar60 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar63);
  auVar66 = vfnmadd213ps_fma(auVar63,auVar65,auVar229);
  auVar67 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar66 = vfnmadd213ps_fma(auVar64,auVar65,auVar229);
  auVar68 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar66 = vpmovsxwd_avx(auVar66);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar221._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar221._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar221._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar221._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar66 = vpmovsxwd_avx(auVar65);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar217._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar217._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar217._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar217._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar58 * 0xe + 6);
  auVar66 = vpmovsxwd_avx(auVar60);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar61);
  auVar230._0_4_ = auVar67._0_4_ * auVar66._0_4_;
  auVar230._4_4_ = auVar67._4_4_ * auVar66._4_4_;
  auVar230._8_4_ = auVar67._8_4_ * auVar66._8_4_;
  auVar230._12_4_ = auVar67._12_4_ * auVar66._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar10);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar61);
  auVar152._0_4_ = auVar67._0_4_ * auVar66._0_4_;
  auVar152._4_4_ = auVar67._4_4_ * auVar66._4_4_;
  auVar152._8_4_ = auVar67._8_4_ * auVar66._8_4_;
  auVar152._12_4_ = auVar67._12_4_ * auVar66._12_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar58 * 0x15 + 6);
  auVar66 = vpmovsxwd_avx(auVar67);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar69);
  auVar193._0_4_ = auVar68._0_4_ * auVar66._0_4_;
  auVar193._4_4_ = auVar68._4_4_ * auVar66._4_4_;
  auVar193._8_4_ = auVar68._8_4_ * auVar66._8_4_;
  auVar193._12_4_ = auVar68._12_4_ * auVar66._12_4_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar66 = vpmovsxwd_avx(auVar61);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar69);
  auVar132._0_4_ = auVar68._0_4_ * auVar66._0_4_;
  auVar132._4_4_ = auVar68._4_4_ * auVar66._4_4_;
  auVar132._8_4_ = auVar68._8_4_ * auVar66._8_4_;
  auVar132._12_4_ = auVar68._12_4_ * auVar66._12_4_;
  auVar66 = vpminsd_avx(auVar221,auVar217);
  auVar65 = vpminsd_avx(auVar230,auVar152);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar65 = vpminsd_avx(auVar193,auVar132);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar68._4_4_ = uVar150;
  auVar68._0_4_ = uVar150;
  auVar68._8_4_ = uVar150;
  auVar68._12_4_ = uVar150;
  auVar65 = vmaxps_avx512vl(auVar65,auVar68);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar69._8_4_ = 0x3f7ffffa;
  auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar69._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar66,auVar69);
  auVar66 = vpmaxsd_avx(auVar221,auVar217);
  auVar65 = vpmaxsd_avx(auVar230,auVar152);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar65 = vpmaxsd_avx(auVar193,auVar132);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar62._4_4_ = uVar150;
  auVar62._0_4_ = uVar150;
  auVar62._8_4_ = uVar150;
  auVar62._12_4_ = uVar150;
  auVar65 = vminps_avx512vl(auVar65,auVar62);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar11._8_4_ = 0x3f800003;
  auVar11._0_8_ = 0x3f8000033f800003;
  auVar11._12_4_ = 0x3f800003;
  auVar66 = vmulps_avx512vl(auVar66,auVar11);
  auVar65 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_3c0,auVar66,2);
  uVar14 = vpcmpgtd_avx512vl(auVar65,_DAT_01f4ad30);
  local_798 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar14));
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_7a0 = prim;
LAB_017ef8a6:
  if (local_798 == 0) {
LAB_017f224b:
    return local_798 != 0;
  }
  lVar52 = 0;
  for (uVar54 = local_798; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  local_898 = (ulong)*(uint *)(prim + 2);
  pGVar1 = (context->scene->geometries).items[local_898].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar1->field_0x58 +
                           pGVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar52 * 4 + 6));
  p_Var2 = pGVar1[1].intersectionFilterN;
  lVar52 = *(long *)&pGVar1[1].time_range.upper;
  auVar66 = *(undefined1 (*) [16])(lVar52 + (long)p_Var2 * uVar54);
  auVar65 = *(undefined1 (*) [16])(lVar52 + (uVar54 + 1) * (long)p_Var2);
  local_608 = local_798 - 1 & local_798;
  if (local_608 != 0) {
    uVar56 = local_608 - 1 & local_608;
    for (uVar58 = local_608; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar255._4_4_ = uVar150;
  auVar255._0_4_ = uVar150;
  auVar255._8_4_ = uVar150;
  auVar255._12_4_ = uVar150;
  local_440._16_4_ = uVar150;
  local_440._0_16_ = auVar255;
  local_440._20_4_ = uVar150;
  local_440._24_4_ = uVar150;
  local_440._28_4_ = uVar150;
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar261._4_4_ = uVar150;
  auVar261._0_4_ = uVar150;
  auVar261._8_4_ = uVar150;
  auVar261._12_4_ = uVar150;
  local_460._16_4_ = uVar150;
  local_460._0_16_ = auVar261;
  local_460._20_4_ = uVar150;
  local_460._24_4_ = uVar150;
  local_460._28_4_ = uVar150;
  auVar60 = vunpcklps_avx(auVar255,auVar261);
  fVar215 = *(float *)(ray + k * 4 + 0x60);
  auVar262._4_4_ = fVar215;
  auVar262._0_4_ = fVar215;
  auVar262._8_4_ = fVar215;
  auVar262._12_4_ = fVar215;
  local_480._16_4_ = fVar215;
  local_480._0_16_ = auVar262;
  local_480._20_4_ = fVar215;
  local_480._24_4_ = fVar215;
  local_480._28_4_ = fVar215;
  local_710 = vinsertps_avx(auVar60,auVar262,0x28);
  auVar222._0_4_ = auVar66._0_4_ + auVar65._0_4_;
  auVar222._4_4_ = auVar66._4_4_ + auVar65._4_4_;
  auVar222._8_4_ = auVar66._8_4_ + auVar65._8_4_;
  auVar222._12_4_ = auVar66._12_4_ + auVar65._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar60 = vmulps_avx512vl(auVar222,auVar16);
  auVar60 = vsubps_avx(auVar60,auVar10);
  auVar60 = vdpps_avx(auVar60,local_710,0x7f);
  fVar149 = *(float *)(ray + k * 4 + 0x30);
  auVar253 = ZEXT464((uint)fVar149);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar254 = ZEXT1664(local_720);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = local_720._0_4_;
  auVar61 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar67 = vfnmadd213ss_fma(auVar61,local_720,ZEXT416(0x40000000));
  local_320 = auVar60._0_4_ * auVar61._0_4_ * auVar67._0_4_;
  auVar232._4_4_ = local_320;
  auVar232._0_4_ = local_320;
  auVar232._8_4_ = local_320;
  auVar232._12_4_ = local_320;
  fStack_410 = local_320;
  _local_420 = auVar232;
  fStack_40c = local_320;
  fStack_408 = local_320;
  fStack_404 = local_320;
  auVar60 = vfmadd231ps_fma(auVar10,local_710,auVar232);
  auVar60 = vblendps_avx(auVar60,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar60);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(lVar52 + (uVar54 + 2) * (long)p_Var2),auVar60);
  auVar242 = ZEXT1664(auVar10);
  auVar65 = vsubps_avx(auVar65,auVar60);
  auVar247 = ZEXT1664(auVar65);
  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar52 + (uVar54 + 3) * (long)p_Var2),auVar60);
  auVar72 = vbroadcastss_avx512vl(auVar66);
  auVar80._8_4_ = 1;
  auVar80._0_8_ = 0x100000001;
  auVar80._12_4_ = 1;
  auVar80._16_4_ = 1;
  auVar80._20_4_ = 1;
  auVar80._24_4_ = 1;
  auVar80._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar66);
  auVar73 = vpermps_avx512vl(auVar80,local_6a0);
  auVar81._8_4_ = 2;
  auVar81._0_8_ = 0x200000002;
  auVar81._12_4_ = 2;
  auVar81._16_4_ = 2;
  auVar81._20_4_ = 2;
  auVar81._24_4_ = 2;
  auVar81._28_4_ = 2;
  auVar74 = vpermps_avx512vl(auVar81,local_6a0);
  auVar82._8_4_ = 3;
  auVar82._0_8_ = 0x300000003;
  auVar82._12_4_ = 3;
  auVar82._16_4_ = 3;
  auVar82._20_4_ = 3;
  auVar82._24_4_ = 3;
  auVar82._28_4_ = 3;
  auVar75 = vpermps_avx512vl(auVar82,local_6a0);
  auVar76 = vbroadcastss_avx512vl(auVar65);
  local_6e0 = ZEXT1632(auVar65);
  auVar77 = vpermps_avx512vl(auVar80,local_6e0);
  auVar78 = vpermps_avx512vl(auVar81,local_6e0);
  local_820 = vpermps_avx512vl(auVar82,local_6e0);
  auVar263 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar10);
  auVar264 = ZEXT3264(local_840);
  local_6c0 = ZEXT1632(auVar10);
  local_860 = vpermps_avx512vl(auVar80,local_6c0);
  auVar265 = ZEXT3264(local_860);
  local_280 = vpermps_avx512vl(auVar81,local_6c0);
  local_2a0 = vpermps_avx512vl(auVar82,local_6c0);
  local_260 = vbroadcastss_avx512vl(auVar60);
  _local_700 = ZEXT1632(auVar60);
  local_2e0 = vpermps_avx2(auVar80,_local_700);
  local_220 = vpermps_avx2(auVar81,_local_700);
  local_300 = vpermps_avx2(auVar82,_local_700);
  auVar66 = vfmadd231ps_fma(ZEXT432((uint)(fVar215 * fVar215)),local_460,local_460);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_440,local_440);
  local_240._0_4_ = auVar66._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  auVar79._16_4_ = 0x7fffffff;
  auVar79._20_4_ = 0x7fffffff;
  auVar79._24_4_ = 0x7fffffff;
  auVar79._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar79);
  local_650 = ZEXT416((uint)local_320);
  local_320 = fVar149 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_530 = vpbroadcastd_avx512vl();
  uVar54 = 0;
  bVar51 = 0;
  local_a28 = 1;
  local_540 = vpbroadcastd_avx512vl();
  auVar66 = vsqrtss_avx(local_720,local_720);
  local_884 = auVar66._0_4_;
  auVar66 = vsqrtss_avx(local_720,local_720);
  local_888 = auVar66._0_4_;
  auVar168 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar227 = ZEXT3264(_DAT_01f7b040);
  local_2c0 = local_260;
  do {
    local_3b0 = auVar168._0_16_;
    auVar66 = vmovshdup_avx(local_3b0);
    auVar66 = vsubps_avx(auVar66,local_3b0);
    auVar133._0_4_ = auVar66._0_4_;
    fVar215 = auVar133._0_4_ * 0.04761905;
    uVar150 = auVar168._0_4_;
    auVar220._4_4_ = uVar150;
    auVar220._0_4_ = uVar150;
    auVar220._8_4_ = uVar150;
    auVar220._12_4_ = uVar150;
    auVar220._16_4_ = uVar150;
    auVar220._20_4_ = uVar150;
    auVar220._24_4_ = uVar150;
    auVar220._28_4_ = uVar150;
    auVar133._4_4_ = auVar133._0_4_;
    auVar133._8_4_ = auVar133._0_4_;
    auVar133._12_4_ = auVar133._0_4_;
    local_800._16_4_ = auVar133._0_4_;
    local_800._0_16_ = auVar133;
    local_800._20_4_ = auVar133._0_4_;
    local_800._24_4_ = auVar133._0_4_;
    local_800._28_4_ = auVar133._0_4_;
    auVar66 = vfmadd231ps_fma(auVar220,local_800,auVar227._0_32_);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar79 = vsubps_avx512vl(auVar79,ZEXT1632(auVar66));
    fVar190 = auVar66._0_4_;
    fVar209 = auVar66._4_4_;
    fVar210 = auVar66._8_4_;
    fVar211 = auVar66._12_4_;
    fVar213 = auVar79._0_4_;
    fVar214 = auVar79._4_4_;
    fVar234 = auVar79._8_4_;
    fVar235 = auVar79._12_4_;
    fVar169 = auVar79._16_4_;
    fVar236 = auVar79._20_4_;
    fVar237 = auVar79._24_4_;
    auVar84._4_4_ = fVar214 * fVar214 * -fVar209;
    auVar84._0_4_ = fVar213 * fVar213 * -fVar190;
    auVar84._8_4_ = fVar234 * fVar234 * -fVar210;
    auVar84._12_4_ = fVar235 * fVar235 * -fVar211;
    auVar84._16_4_ = fVar169 * fVar169 * -0.0;
    auVar84._20_4_ = fVar236 * fVar236 * -0.0;
    auVar84._24_4_ = fVar237 * fVar237 * -0.0;
    auVar84._28_4_ = 0x80000000;
    auVar242._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * fVar211,
                            CONCAT48(fVar210 * fVar210,CONCAT44(fVar209 * fVar209,fVar190 * fVar190)
                                    )));
    fVar243 = fVar190 * 3.0;
    fVar249 = fVar209 * 3.0;
    fVar250 = fVar210 * 3.0;
    fVar251 = fVar211 * 3.0;
    auVar248._28_36_ = auVar247._28_36_;
    auVar248._0_28_ = ZEXT1628(CONCAT412(fVar251,CONCAT48(fVar250,CONCAT44(fVar249,fVar243))));
    auVar227._0_4_ = (fVar243 + -5.0) * fVar190 * fVar190;
    auVar227._4_4_ = (fVar249 + -5.0) * fVar209 * fVar209;
    auVar227._8_4_ = (fVar250 + -5.0) * fVar210 * fVar210;
    auVar227._12_4_ = (fVar251 + -5.0) * fVar211 * fVar211;
    auVar227._16_4_ = 0x80000000;
    auVar227._20_4_ = 0x80000000;
    auVar227._28_36_ = auVar168._28_36_;
    auVar227._24_4_ = 0x80000000;
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar81 = vaddps_avx512vl(auVar227._0_32_,auVar80);
    auVar168._0_4_ = fVar213 * fVar213;
    auVar168._4_4_ = fVar214 * fVar214;
    auVar168._8_4_ = fVar234 * fVar234;
    auVar168._12_4_ = fVar235 * fVar235;
    auVar168._16_4_ = fVar169 * fVar169;
    auVar168._20_4_ = fVar236 * fVar236;
    auVar168._28_36_ = auVar253._28_36_;
    auVar168._24_4_ = fVar237 * fVar237;
    auVar87._4_4_ = auVar168._4_4_ * (fVar214 * 3.0 + -5.0);
    auVar87._0_4_ = auVar168._0_4_ * (fVar213 * 3.0 + -5.0);
    auVar87._8_4_ = auVar168._8_4_ * (fVar234 * 3.0 + -5.0);
    auVar87._12_4_ = auVar168._12_4_ * (fVar235 * 3.0 + -5.0);
    auVar87._16_4_ = auVar168._16_4_ * (fVar169 * 3.0 + -5.0);
    auVar87._20_4_ = auVar168._20_4_ * (fVar236 * 3.0 + -5.0);
    auVar87._24_4_ = auVar168._24_4_ * (fVar237 * 3.0 + -5.0);
    auVar87._28_4_ = auVar254._28_4_ + -5.0;
    auVar82 = vaddps_avx512vl(auVar87,auVar80);
    fVar212 = auVar79._28_4_;
    auVar88._4_4_ = fVar209 * fVar209 * -fVar214;
    auVar88._0_4_ = fVar190 * fVar190 * -fVar213;
    auVar88._8_4_ = fVar210 * fVar210 * -fVar234;
    auVar88._12_4_ = fVar211 * fVar211 * -fVar235;
    auVar88._16_4_ = -fVar169 * 0.0 * 0.0;
    auVar88._20_4_ = -fVar236 * 0.0 * 0.0;
    auVar88._24_4_ = -fVar237 * 0.0 * 0.0;
    auVar88._28_4_ = -fVar212;
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar79 = vmulps_avx512vl(auVar84,auVar83);
    auVar84 = vmulps_avx512vl(auVar81,auVar83);
    auVar82 = vmulps_avx512vl(auVar82,auVar83);
    auVar85 = vmulps_avx512vl(auVar88,auVar83);
    auVar86 = vmulps_avx512vl(local_2c0,auVar85);
    auVar89._4_4_ = local_2e0._4_4_ * auVar85._4_4_;
    auVar89._0_4_ = local_2e0._0_4_ * auVar85._0_4_;
    auVar89._8_4_ = local_2e0._8_4_ * auVar85._8_4_;
    auVar89._12_4_ = local_2e0._12_4_ * auVar85._12_4_;
    auVar89._16_4_ = local_2e0._16_4_ * auVar85._16_4_;
    auVar89._20_4_ = local_2e0._20_4_ * auVar85._20_4_;
    auVar89._24_4_ = local_2e0._24_4_ * auVar85._24_4_;
    auVar89._28_4_ = auVar81._28_4_;
    auVar81 = vmulps_avx512vl(local_220,auVar85);
    auVar90._4_4_ = local_300._4_4_ * auVar85._4_4_;
    auVar90._0_4_ = local_300._0_4_ * auVar85._0_4_;
    auVar90._8_4_ = local_300._8_4_ * auVar85._8_4_;
    auVar90._12_4_ = local_300._12_4_ * auVar85._12_4_;
    auVar90._16_4_ = local_300._16_4_ * auVar85._16_4_;
    auVar90._20_4_ = local_300._20_4_ * auVar85._20_4_;
    auVar90._24_4_ = local_300._24_4_ * auVar85._24_4_;
    auVar90._28_4_ = auVar85._28_4_;
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar264._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar89,auVar82,auVar265._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar82,local_280);
    auVar82 = vfmadd231ps_avx512vl(auVar90,local_2a0,auVar82);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar76);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar77);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar263._0_32_,auVar84);
    auVar87 = vfmadd231ps_avx512vl(auVar85,auVar79,auVar72);
    auVar88 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar73);
    auVar89 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar74);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar79);
    auVar91._4_4_ = (fVar214 + fVar214) * fVar209;
    auVar91._0_4_ = (fVar213 + fVar213) * fVar190;
    auVar91._8_4_ = (fVar234 + fVar234) * fVar210;
    auVar91._12_4_ = (fVar235 + fVar235) * fVar211;
    auVar91._16_4_ = (fVar169 + fVar169) * 0.0;
    auVar91._20_4_ = (fVar236 + fVar236) * 0.0;
    auVar91._24_4_ = (fVar237 + fVar237) * 0.0;
    auVar91._28_4_ = auVar84._28_4_;
    auVar79 = vsubps_avx(auVar91,auVar168._0_32_);
    auVar101._0_28_ =
         ZEXT1628(CONCAT412((fVar211 + fVar211) * (fVar251 + -5.0) + fVar251 * fVar211,
                            CONCAT48((fVar210 + fVar210) * (fVar250 + -5.0) + fVar250 * fVar210,
                                     CONCAT44((fVar209 + fVar209) * (fVar249 + -5.0) +
                                              fVar249 * fVar209,
                                              (fVar190 + fVar190) * (fVar243 + -5.0) +
                                              fVar243 * fVar190))));
    auVar101._28_4_ = auVar247._28_4_ + -5.0 + 0.0;
    auVar80 = vaddps_avx512vl(auVar248._0_32_,auVar80);
    auVar92._4_4_ = (fVar214 + fVar214) * auVar80._4_4_;
    auVar92._0_4_ = (fVar213 + fVar213) * auVar80._0_4_;
    auVar92._8_4_ = (fVar234 + fVar234) * auVar80._8_4_;
    auVar92._12_4_ = (fVar235 + fVar235) * auVar80._12_4_;
    auVar92._16_4_ = (fVar169 + fVar169) * auVar80._16_4_;
    auVar92._20_4_ = (fVar236 + fVar236) * auVar80._20_4_;
    auVar92._24_4_ = (fVar237 + fVar237) * auVar80._24_4_;
    auVar92._28_4_ = auVar80._28_4_;
    auVar93._4_4_ = fVar214 * 3.0 * fVar214;
    auVar93._0_4_ = fVar213 * 3.0 * fVar213;
    auVar93._8_4_ = fVar234 * 3.0 * fVar234;
    auVar93._12_4_ = fVar235 * 3.0 * fVar235;
    auVar93._16_4_ = fVar169 * 3.0 * fVar169;
    auVar93._20_4_ = fVar236 * 3.0 * fVar236;
    auVar93._24_4_ = fVar237 * 3.0 * fVar237;
    auVar93._28_4_ = fVar212;
    auVar80 = vsubps_avx(auVar92,auVar93);
    auVar81 = vsubps_avx(auVar242._0_32_,auVar91);
    auVar85 = vmulps_avx512vl(auVar79,auVar83);
    auVar86 = vmulps_avx512vl(auVar101,auVar83);
    auVar80 = vmulps_avx512vl(auVar80,auVar83);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar83 = vmulps_avx512vl(local_2c0,auVar81);
    auVar94._4_4_ = local_2e0._4_4_ * auVar81._4_4_;
    auVar94._0_4_ = local_2e0._0_4_ * auVar81._0_4_;
    auVar94._8_4_ = local_2e0._8_4_ * auVar81._8_4_;
    auVar94._12_4_ = local_2e0._12_4_ * auVar81._12_4_;
    auVar94._16_4_ = local_2e0._16_4_ * auVar81._16_4_;
    auVar94._20_4_ = local_2e0._20_4_ * auVar81._20_4_;
    auVar94._24_4_ = local_2e0._24_4_ * auVar81._24_4_;
    auVar94._28_4_ = auVar79._28_4_;
    auVar79 = vmulps_avx512vl(local_220,auVar81);
    auVar95._4_4_ = local_300._4_4_ * auVar81._4_4_;
    auVar95._0_4_ = local_300._0_4_ * auVar81._0_4_;
    auVar95._8_4_ = local_300._8_4_ * auVar81._8_4_;
    auVar95._12_4_ = local_300._12_4_ * auVar81._12_4_;
    auVar95._16_4_ = local_300._16_4_ * auVar81._16_4_;
    auVar95._20_4_ = local_300._20_4_ * auVar81._20_4_;
    auVar95._24_4_ = local_300._24_4_ * auVar81._24_4_;
    auVar95._28_4_ = auVar81._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar264._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar94,auVar80,auVar265._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar80,local_280);
    auVar80 = vfmadd231ps_avx512vl(auVar95,local_2a0,auVar80);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar76);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar86,auVar77);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar86,auVar78);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar263._0_32_,auVar86);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar85,auVar72);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar73);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar85,auVar74);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar85);
    auVar107._4_4_ = auVar81._4_4_ * fVar215;
    auVar107._0_4_ = auVar81._0_4_ * fVar215;
    auVar107._8_4_ = auVar81._8_4_ * fVar215;
    auVar107._12_4_ = auVar81._12_4_ * fVar215;
    auVar107._16_4_ = auVar81._16_4_ * fVar215;
    auVar107._20_4_ = auVar81._20_4_ * fVar215;
    auVar107._24_4_ = auVar81._24_4_ * fVar215;
    auVar107._28_4_ = fVar212 + fVar212;
    auVar108._4_4_ = auVar83._4_4_ * fVar215;
    auVar108._0_4_ = auVar83._0_4_ * fVar215;
    auVar108._8_4_ = auVar83._8_4_ * fVar215;
    auVar108._12_4_ = auVar83._12_4_ * fVar215;
    auVar108._16_4_ = auVar83._16_4_ * fVar215;
    auVar108._20_4_ = auVar83._20_4_ * fVar215;
    auVar108._24_4_ = auVar83._24_4_ * fVar215;
    auVar108._28_4_ = auVar84._28_4_;
    auVar109._4_4_ = auVar79._4_4_ * fVar215;
    auVar109._0_4_ = auVar79._0_4_ * fVar215;
    auVar109._8_4_ = auVar79._8_4_ * fVar215;
    auVar109._12_4_ = auVar79._12_4_ * fVar215;
    auVar109._16_4_ = auVar79._16_4_ * fVar215;
    auVar109._20_4_ = auVar79._20_4_ * fVar215;
    auVar109._24_4_ = auVar79._24_4_ * fVar215;
    auVar109._28_4_ = 0;
    fVar190 = fVar215 * auVar80._0_4_;
    fVar209 = fVar215 * auVar80._4_4_;
    auVar99._4_4_ = fVar209;
    auVar99._0_4_ = fVar190;
    fVar210 = fVar215 * auVar80._8_4_;
    auVar99._8_4_ = fVar210;
    fVar211 = fVar215 * auVar80._12_4_;
    auVar99._12_4_ = fVar211;
    fVar212 = fVar215 * auVar80._16_4_;
    auVar99._16_4_ = fVar212;
    fVar213 = fVar215 * auVar80._20_4_;
    auVar99._20_4_ = fVar213;
    fVar214 = fVar215 * auVar80._24_4_;
    auVar99._24_4_ = fVar214;
    auVar99._28_4_ = fVar215;
    auVar66 = vxorps_avx512vl(auVar263._0_16_,auVar263._0_16_);
    auVar90 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar91 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar253 = ZEXT3264(auVar91);
    auVar81 = ZEXT1632(auVar66);
    auVar92 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar81);
    auVar254 = ZEXT3264(auVar92);
    auVar102._0_4_ = auVar82._0_4_ + fVar190;
    auVar102._4_4_ = auVar82._4_4_ + fVar209;
    auVar102._8_4_ = auVar82._8_4_ + fVar210;
    auVar102._12_4_ = auVar82._12_4_ + fVar211;
    auVar102._16_4_ = auVar82._16_4_ + fVar212;
    auVar102._20_4_ = auVar82._20_4_ + fVar213;
    auVar102._24_4_ = auVar82._24_4_ + fVar214;
    auVar102._28_4_ = auVar82._28_4_ + fVar215;
    auVar79 = vmaxps_avx(auVar82,auVar102);
    auVar80 = vminps_avx(auVar82,auVar102);
    auVar85 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar81);
    auVar93 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar81);
    auVar94 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar81);
    auVar104 = ZEXT1632(auVar66);
    auVar95 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,auVar104);
    auVar81 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar104);
    auVar86 = vsubps_avx512vl(auVar85,auVar81);
    auVar81 = vsubps_avx(auVar90,auVar87);
    auVar247 = ZEXT3264(auVar81);
    auVar82 = vsubps_avx(auVar91,auVar88);
    auVar242 = ZEXT3264(auVar82);
    auVar84 = vsubps_avx(auVar92,auVar89);
    auVar83 = vmulps_avx512vl(auVar82,auVar109);
    auVar83 = vfmsub231ps_avx512vl(auVar83,auVar108,auVar84);
    auVar96 = vmulps_avx512vl(auVar84,auVar107);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar109,auVar81);
    auVar97 = vmulps_avx512vl(auVar81,auVar108);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar107,auVar82);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar83,auVar83);
    auVar83 = vmulps_avx512vl(auVar84,auVar84);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar82);
    auVar97 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar81);
    auVar98 = vrcp14ps_avx512vl(auVar97);
    auVar83._8_4_ = 0x3f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._12_4_ = 0x3f800000;
    auVar83._16_4_ = 0x3f800000;
    auVar83._20_4_ = 0x3f800000;
    auVar83._24_4_ = 0x3f800000;
    auVar83._28_4_ = 0x3f800000;
    auVar83 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar83);
    auVar83 = vfmadd132ps_avx512vl(auVar83,auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar83);
    auVar98 = vmulps_avx512vl(auVar82,auVar95);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar94,auVar84);
    auVar99 = vmulps_avx512vl(auVar84,auVar93);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar95,auVar81);
    auVar100 = vmulps_avx512vl(auVar81,auVar94);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar93,auVar82);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar83 = vmulps_avx512vl(auVar98,auVar83);
    auVar83 = vmaxps_avx512vl(auVar96,auVar83);
    auVar83 = vsqrtps_avx512vl(auVar83);
    auVar96 = vmaxps_avx512vl(auVar86,auVar85);
    auVar79 = vmaxps_avx512vl(auVar79,auVar96);
    auVar98 = vaddps_avx512vl(auVar83,auVar79);
    auVar79 = vminps_avx512vl(auVar86,auVar85);
    auVar79 = vminps_avx(auVar80,auVar79);
    auVar79 = vsubps_avx512vl(auVar79,auVar83);
    auVar85._8_4_ = 0x3f800002;
    auVar85._0_8_ = 0x3f8000023f800002;
    auVar85._12_4_ = 0x3f800002;
    auVar85._16_4_ = 0x3f800002;
    auVar85._20_4_ = 0x3f800002;
    auVar85._24_4_ = 0x3f800002;
    auVar85._28_4_ = 0x3f800002;
    auVar80 = vmulps_avx512vl(auVar98,auVar85);
    auVar86._8_4_ = 0x3f7ffffc;
    auVar86._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar86._12_4_ = 0x3f7ffffc;
    auVar86._16_4_ = 0x3f7ffffc;
    auVar86._20_4_ = 0x3f7ffffc;
    auVar86._24_4_ = 0x3f7ffffc;
    auVar86._28_4_ = 0x3f7ffffc;
    auVar79 = vmulps_avx512vl(auVar79,auVar86);
    auVar80 = vmulps_avx512vl(auVar80,auVar80);
    auVar83 = vrsqrt14ps_avx512vl(auVar97);
    auVar96._8_4_ = 0xbf000000;
    auVar96._0_8_ = 0xbf000000bf000000;
    auVar96._12_4_ = 0xbf000000;
    auVar96._16_4_ = 0xbf000000;
    auVar96._20_4_ = 0xbf000000;
    auVar96._24_4_ = 0xbf000000;
    auVar96._28_4_ = 0xbf000000;
    auVar85 = vmulps_avx512vl(auVar97,auVar96);
    fVar215 = auVar83._0_4_;
    fVar190 = auVar83._4_4_;
    fVar209 = auVar83._8_4_;
    fVar210 = auVar83._12_4_;
    fVar211 = auVar83._16_4_;
    fVar212 = auVar83._20_4_;
    fVar213 = auVar83._24_4_;
    auVar100._4_4_ = fVar190 * fVar190 * fVar190 * auVar85._4_4_;
    auVar100._0_4_ = fVar215 * fVar215 * fVar215 * auVar85._0_4_;
    auVar100._8_4_ = fVar209 * fVar209 * fVar209 * auVar85._8_4_;
    auVar100._12_4_ = fVar210 * fVar210 * fVar210 * auVar85._12_4_;
    auVar100._16_4_ = fVar211 * fVar211 * fVar211 * auVar85._16_4_;
    auVar100._20_4_ = fVar212 * fVar212 * fVar212 * auVar85._20_4_;
    auVar100._24_4_ = fVar213 * fVar213 * fVar213 * auVar85._24_4_;
    auVar100._28_4_ = auVar98._28_4_;
    auVar97._8_4_ = 0x3fc00000;
    auVar97._0_8_ = 0x3fc000003fc00000;
    auVar97._12_4_ = 0x3fc00000;
    auVar97._16_4_ = 0x3fc00000;
    auVar97._20_4_ = 0x3fc00000;
    auVar97._24_4_ = 0x3fc00000;
    auVar97._28_4_ = 0x3fc00000;
    auVar83 = vfmadd231ps_avx512vl(auVar100,auVar83,auVar97);
    auVar85 = vmulps_avx512vl(auVar81,auVar83);
    auVar86 = vmulps_avx512vl(auVar82,auVar83);
    auVar96 = vmulps_avx512vl(auVar84,auVar83);
    auVar97 = vsubps_avx512vl(auVar104,auVar87);
    auVar99 = vsubps_avx512vl(auVar104,auVar88);
    auVar100 = vsubps_avx512vl(auVar104,auVar89);
    auVar98 = vmulps_avx512vl(local_480,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar98,local_460,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar98,local_440,auVar97);
    auVar101 = vmulps_avx512vl(auVar100,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar102 = vmulps_avx512vl(local_480,auVar96);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar86,local_460);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar85,local_440);
    auVar96 = vmulps_avx512vl(auVar100,auVar96);
    auVar86 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar86);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar85);
    auVar86 = vmulps_avx512vl(auVar102,auVar102);
    auVar96 = vsubps_avx512vl(local_240,auVar86);
    auVar103 = vmulps_avx512vl(auVar102,auVar85);
    auVar98 = vsubps_avx512vl(auVar98,auVar103);
    auVar103 = vaddps_avx512vl(auVar98,auVar98);
    auVar98 = vmulps_avx512vl(auVar85,auVar85);
    local_680 = vsubps_avx512vl(auVar101,auVar98);
    auVar80 = vsubps_avx512vl(local_680,auVar80);
    local_7c0 = vmulps_avx512vl(auVar103,auVar103);
    auVar98._8_4_ = 0x40800000;
    auVar98._0_8_ = 0x4080000040800000;
    auVar98._12_4_ = 0x40800000;
    auVar98._16_4_ = 0x40800000;
    auVar98._20_4_ = 0x40800000;
    auVar98._24_4_ = 0x40800000;
    auVar98._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar96,auVar98);
    auVar98 = vmulps_avx512vl(_local_580,auVar80);
    auVar98 = vsubps_avx512vl(local_7c0,auVar98);
    uVar58 = vcmpps_avx512vl(auVar98,auVar104,5);
    bVar49 = (byte)uVar58;
    if (bVar49 == 0) {
LAB_017f05ea:
      auVar227 = ZEXT3264(_DAT_01f7b040);
      auVar263 = ZEXT3264(local_820);
      auVar264 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_860);
    }
    else {
      auVar98 = vsqrtps_avx512vl(auVar98);
      local_5a0 = vaddps_avx512vl(auVar96,auVar96);
      local_5c0 = vrcp14ps_avx512vl(local_5a0);
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      auVar101 = vfnmadd213ps_avx512vl(local_5c0,local_5a0,auVar104);
      auVar101 = vfmadd132ps_avx512vl(auVar101,local_5c0,local_5c0);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      local_5e0 = vxorps_avx512vl(auVar103,auVar26);
      auVar104 = vsubps_avx512vl(local_5e0,auVar98);
      local_7e0 = vmulps_avx512vl(auVar104,auVar101);
      auVar98 = vsubps_avx512vl(auVar98,auVar103);
      local_740 = vmulps_avx512vl(auVar98,auVar101);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar98,local_7e0);
      auVar105._0_4_ =
           (uint)(bVar49 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar98._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar57 * auVar101._4_4_ | (uint)!bVar57 * auVar98._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar57 * auVar101._8_4_ | (uint)!bVar57 * auVar98._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar57 * auVar101._12_4_ | (uint)!bVar57 * auVar98._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar105._16_4_ = (uint)bVar57 * auVar101._16_4_ | (uint)!bVar57 * auVar98._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar105._20_4_ = (uint)bVar57 * auVar101._20_4_ | (uint)!bVar57 * auVar98._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar105._24_4_ = (uint)bVar57 * auVar101._24_4_ | (uint)!bVar57 * auVar98._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar105._28_4_ = (uint)bVar57 * auVar101._28_4_ | (uint)!bVar57 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar98,local_740);
      auVar106._0_4_ =
           (uint)(bVar49 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar98._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar57 * auVar101._4_4_ | (uint)!bVar57 * auVar98._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar57 * auVar101._8_4_ | (uint)!bVar57 * auVar98._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar57 * auVar101._12_4_ | (uint)!bVar57 * auVar98._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar57 * auVar101._16_4_ | (uint)!bVar57 * auVar98._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar57 * auVar101._20_4_ | (uint)!bVar57 * auVar98._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar57 * auVar101._24_4_ | (uint)!bVar57 * auVar98._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar106._28_4_ = (uint)bVar57 * auVar101._28_4_ | (uint)!bVar57 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar86,auVar98);
      local_760 = vmaxps_avx512vl(local_260,auVar98);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_760,auVar27);
      vandps_avx512vl(auVar96,auVar98);
      uVar56 = vcmpps_avx512vl(local_600,local_600,1);
      uVar58 = uVar58 & uVar56;
      bVar55 = (byte)uVar58;
      if (bVar55 != 0) {
        uVar56 = vcmpps_avx512vl(auVar80,_DAT_01f7b000,2);
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar80,auVar86);
        bVar53 = (byte)uVar56;
        uVar59 = (uint)(bVar53 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar53 & 1) * local_600._0_4_;
        bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
        uVar123 = (uint)bVar57 * auVar96._4_4_ | (uint)!bVar57 * local_600._4_4_;
        bVar57 = (bool)((byte)(uVar56 >> 2) & 1);
        uVar124 = (uint)bVar57 * auVar96._8_4_ | (uint)!bVar57 * local_600._8_4_;
        bVar57 = (bool)((byte)(uVar56 >> 3) & 1);
        uVar125 = (uint)bVar57 * auVar96._12_4_ | (uint)!bVar57 * local_600._12_4_;
        bVar57 = (bool)((byte)(uVar56 >> 4) & 1);
        uVar126 = (uint)bVar57 * auVar96._16_4_ | (uint)!bVar57 * local_600._16_4_;
        bVar57 = (bool)((byte)(uVar56 >> 5) & 1);
        uVar127 = (uint)bVar57 * auVar96._20_4_ | (uint)!bVar57 * local_600._20_4_;
        bVar57 = (bool)((byte)(uVar56 >> 6) & 1);
        uVar128 = (uint)bVar57 * auVar96._24_4_ | (uint)!bVar57 * local_600._24_4_;
        bVar57 = SUB81(uVar56 >> 7,0);
        uVar129 = (uint)bVar57 * auVar96._28_4_ | (uint)!bVar57 * local_600._28_4_;
        auVar105._0_4_ = (bVar55 & 1) * uVar59 | !(bool)(bVar55 & 1) * auVar105._0_4_;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar105._4_4_ = bVar57 * uVar123 | !bVar57 * auVar105._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar105._8_4_ = bVar57 * uVar124 | !bVar57 * auVar105._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar105._12_4_ = bVar57 * uVar125 | !bVar57 * auVar105._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar105._16_4_ = bVar57 * uVar126 | !bVar57 * auVar105._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar105._20_4_ = bVar57 * uVar127 | !bVar57 * auVar105._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar105._24_4_ = bVar57 * uVar128 | !bVar57 * auVar105._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar105._28_4_ = bVar57 * uVar129 | !bVar57 * auVar105._28_4_;
        auVar80 = vblendmps_avx512vl(auVar86,auVar80);
        bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar9 = SUB81(uVar56 >> 7,0);
        auVar106._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar53 & 1) * auVar80._0_4_ | !(bool)(bVar53 & 1) * uVar59) |
             !(bool)(bVar55 & 1) * auVar106._0_4_;
        bVar3 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar106._4_4_ =
             (uint)bVar3 * ((uint)bVar57 * auVar80._4_4_ | !bVar57 * uVar123) |
             !bVar3 * auVar106._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar106._8_4_ =
             (uint)bVar57 * ((uint)bVar4 * auVar80._8_4_ | !bVar4 * uVar124) |
             !bVar57 * auVar106._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar106._12_4_ =
             (uint)bVar57 * ((uint)bVar5 * auVar80._12_4_ | !bVar5 * uVar125) |
             !bVar57 * auVar106._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar106._16_4_ =
             (uint)bVar57 * ((uint)bVar6 * auVar80._16_4_ | !bVar6 * uVar126) |
             !bVar57 * auVar106._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar106._20_4_ =
             (uint)bVar57 * ((uint)bVar7 * auVar80._20_4_ | !bVar7 * uVar127) |
             !bVar57 * auVar106._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar106._24_4_ =
             (uint)bVar57 * ((uint)bVar8 * auVar80._24_4_ | !bVar8 * uVar128) |
             !bVar57 * auVar106._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar106._28_4_ =
             (uint)bVar57 * ((uint)bVar9 * auVar80._28_4_ | !bVar9 * uVar129) |
             !bVar57 * auVar106._28_4_;
        bVar49 = (~bVar55 | bVar53) & bVar49;
      }
      if ((bVar49 & 0x7f) == 0) goto LAB_017f05ea;
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar86 = vxorps_avx512vl(auVar95,auVar80);
      auVar96 = vxorps_avx512vl(auVar93,auVar80);
      auVar168 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar98 = vxorps_avx512vl(auVar94,auVar80);
      auVar66 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_650._0_4_)
                              );
      auVar93 = vbroadcastss_avx512vl(auVar66);
      auVar93 = vminps_avx512vl(auVar93,auVar106);
      auVar48._4_4_ = fStack_31c;
      auVar48._0_4_ = local_320;
      auVar48._8_4_ = fStack_318;
      auVar48._12_4_ = fStack_314;
      auVar48._16_4_ = fStack_310;
      auVar48._20_4_ = fStack_30c;
      auVar48._24_4_ = fStack_308;
      auVar48._28_4_ = fStack_304;
      auVar94 = vmaxps_avx512vl(auVar48,auVar105);
      auVar95 = vmulps_avx512vl(auVar100,auVar109);
      auVar95 = vfmadd213ps_avx512vl(auVar99,auVar108,auVar95);
      auVar66 = vfmadd213ps_fma(auVar97,auVar107,auVar95);
      auVar97 = vmulps_avx512vl(local_480,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_460,auVar108);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_440,auVar107);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar95);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar95,auVar107,1);
      auVar108 = vxorps_avx512vl(ZEXT1632(auVar66),auVar80);
      auVar109 = vrcp14ps_avx512vl(auVar97);
      auVar99 = vxorps_avx512vl(auVar97,auVar80);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar101 = vfnmadd213ps_avx512vl(auVar109,auVar97,auVar100);
      auVar66 = vfmadd132ps_fma(auVar101,auVar109,auVar109);
      fVar215 = auVar66._0_4_ * auVar108._0_4_;
      fVar190 = auVar66._4_4_ * auVar108._4_4_;
      auVar32._4_4_ = fVar190;
      auVar32._0_4_ = fVar215;
      fVar209 = auVar66._8_4_ * auVar108._8_4_;
      auVar32._8_4_ = fVar209;
      fVar210 = auVar66._12_4_ * auVar108._12_4_;
      auVar32._12_4_ = fVar210;
      fVar211 = auVar108._16_4_ * 0.0;
      auVar32._16_4_ = fVar211;
      fVar212 = auVar108._20_4_ * 0.0;
      auVar32._20_4_ = fVar212;
      fVar213 = auVar108._24_4_ * 0.0;
      auVar32._24_4_ = fVar213;
      auVar32._28_4_ = auVar108._28_4_;
      uVar14 = vcmpps_avx512vl(auVar97,auVar99,1);
      bVar55 = (byte)uVar12 | (byte)uVar14;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar32,auVar101);
      auVar110._0_4_ =
           (uint)(bVar55 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar109._0_4_;
      bVar57 = (bool)(bVar55 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar57 * auVar104._4_4_ | (uint)!bVar57 * auVar109._4_4_;
      bVar57 = (bool)(bVar55 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar57 * auVar104._8_4_ | (uint)!bVar57 * auVar109._8_4_;
      bVar57 = (bool)(bVar55 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar57 * auVar104._12_4_ | (uint)!bVar57 * auVar109._12_4_;
      bVar57 = (bool)(bVar55 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar57 * auVar104._16_4_ | (uint)!bVar57 * auVar109._16_4_;
      bVar57 = (bool)(bVar55 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar57 * auVar104._20_4_ | (uint)!bVar57 * auVar109._20_4_;
      bVar57 = (bool)(bVar55 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar57 * auVar104._24_4_ | (uint)!bVar57 * auVar109._24_4_;
      auVar110._28_4_ =
           (uint)(bVar55 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar109._28_4_;
      auVar109 = vmaxps_avx512vl(auVar94,auVar110);
      uVar14 = vcmpps_avx512vl(auVar97,auVar99,6);
      bVar55 = (byte)uVar12 | (byte)uVar14;
      auVar111._0_4_ = (uint)(bVar55 & 1) * 0x7f800000 | (uint)!(bool)(bVar55 & 1) * (int)fVar215;
      bVar57 = (bool)(bVar55 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar190;
      bVar57 = (bool)(bVar55 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar209;
      bVar57 = (bool)(bVar55 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar210;
      bVar57 = (bool)(bVar55 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar211;
      bVar57 = (bool)(bVar55 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar212;
      bVar57 = (bool)(bVar55 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar213;
      auVar111._28_4_ =
           (uint)(bVar55 >> 7) * 0x7f800000 | (uint)!(bool)(bVar55 >> 7) * auVar108._28_4_;
      auVar97 = vminps_avx512vl(auVar93,auVar111);
      auVar66 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar66),auVar90);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar66),auVar91);
      auVar93 = ZEXT1632(auVar66);
      auVar92 = vsubps_avx512vl(auVar93,auVar92);
      auVar92 = vmulps_avx512vl(auVar92,auVar86);
      auVar91 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar91);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar90);
      auVar86 = vmulps_avx512vl(local_480,auVar86);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_460,auVar98);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_440,auVar96);
      vandps_avx512vl(auVar86,auVar95);
      uVar12 = vcmpps_avx512vl(auVar86,auVar107,1);
      auVar96 = vxorps_avx512vl(auVar90,auVar80);
      auVar98 = vrcp14ps_avx512vl(auVar86);
      auVar80 = vxorps_avx512vl(auVar86,auVar80);
      auVar254 = ZEXT3264(auVar80);
      auVar90 = vfnmadd213ps_avx512vl(auVar98,auVar86,auVar100);
      auVar66 = vfmadd132ps_fma(auVar90,auVar98,auVar98);
      fVar215 = auVar66._0_4_ * auVar96._0_4_;
      fVar190 = auVar66._4_4_ * auVar96._4_4_;
      auVar33._4_4_ = fVar190;
      auVar33._0_4_ = fVar215;
      fVar209 = auVar66._8_4_ * auVar96._8_4_;
      auVar33._8_4_ = fVar209;
      fVar210 = auVar66._12_4_ * auVar96._12_4_;
      auVar33._12_4_ = fVar210;
      fVar211 = auVar96._16_4_ * 0.0;
      auVar33._16_4_ = fVar211;
      fVar212 = auVar96._20_4_ * 0.0;
      auVar33._20_4_ = fVar212;
      fVar213 = auVar96._24_4_ * 0.0;
      auVar33._24_4_ = fVar213;
      auVar33._28_4_ = auVar96._28_4_;
      uVar14 = vcmpps_avx512vl(auVar86,auVar80,1);
      bVar55 = (byte)uVar12 | (byte)uVar14;
      auVar90 = vblendmps_avx512vl(auVar33,auVar101);
      auVar112._0_4_ =
           (uint)(bVar55 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar98._0_4_;
      bVar57 = (bool)(bVar55 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * auVar98._4_4_;
      bVar57 = (bool)(bVar55 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * auVar98._8_4_;
      bVar57 = (bool)(bVar55 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * auVar98._12_4_;
      bVar57 = (bool)(bVar55 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * auVar98._16_4_;
      bVar57 = (bool)(bVar55 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * auVar98._20_4_;
      bVar57 = (bool)(bVar55 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * auVar98._24_4_;
      auVar112._28_4_ =
           (uint)(bVar55 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar98._28_4_;
      local_880 = vmaxps_avx(auVar109,auVar112);
      auVar253 = ZEXT3264(local_880);
      uVar14 = vcmpps_avx512vl(auVar86,auVar80,6);
      bVar55 = (byte)uVar12 | (byte)uVar14;
      auVar113._0_4_ = (uint)(bVar55 & 1) * 0x7f800000 | (uint)!(bool)(bVar55 & 1) * (int)fVar215;
      bVar57 = (bool)(bVar55 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar190;
      bVar57 = (bool)(bVar55 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar209;
      bVar57 = (bool)(bVar55 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar210;
      bVar57 = (bool)(bVar55 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar211;
      bVar57 = (bool)(bVar55 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar212;
      bVar57 = (bool)(bVar55 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar213;
      auVar113._28_4_ =
           (uint)(bVar55 >> 7) * 0x7f800000 | (uint)!(bool)(bVar55 >> 7) * auVar96._28_4_;
      local_360 = vminps_avx(auVar97,auVar113);
      uVar12 = vcmpps_avx512vl(local_880,local_360,2);
      bVar49 = bVar49 & 0x7f & (byte)uVar12;
      if (bVar49 == 0) goto LAB_017f05ea;
      auVar80 = vmaxps_avx512vl(auVar93,auVar79);
      auVar79 = vfmadd213ps_avx512vl(local_7e0,auVar102,auVar85);
      fVar215 = auVar83._0_4_;
      fVar190 = auVar83._4_4_;
      auVar34._4_4_ = fVar190 * auVar79._4_4_;
      auVar34._0_4_ = fVar215 * auVar79._0_4_;
      fVar209 = auVar83._8_4_;
      auVar34._8_4_ = fVar209 * auVar79._8_4_;
      fVar210 = auVar83._12_4_;
      auVar34._12_4_ = fVar210 * auVar79._12_4_;
      fVar211 = auVar83._16_4_;
      auVar34._16_4_ = fVar211 * auVar79._16_4_;
      fVar212 = auVar83._20_4_;
      auVar34._20_4_ = fVar212 * auVar79._20_4_;
      fVar213 = auVar83._24_4_;
      auVar34._24_4_ = fVar213 * auVar79._24_4_;
      auVar34._28_4_ = auVar79._28_4_;
      auVar79 = vfmadd213ps_avx512vl(local_740,auVar102,auVar85);
      auVar35._4_4_ = fVar190 * auVar79._4_4_;
      auVar35._0_4_ = fVar215 * auVar79._0_4_;
      auVar35._8_4_ = fVar209 * auVar79._8_4_;
      auVar35._12_4_ = fVar210 * auVar79._12_4_;
      auVar35._16_4_ = fVar211 * auVar79._16_4_;
      auVar35._20_4_ = fVar212 * auVar79._20_4_;
      auVar35._24_4_ = fVar213 * auVar79._24_4_;
      auVar35._28_4_ = auVar79._28_4_;
      auVar79 = vminps_avx512vl(auVar34,auVar100);
      auVar43 = ZEXT812(0);
      auVar86 = ZEXT1232(auVar43) << 0x20;
      auVar79 = vmaxps_avx(auVar79,ZEXT1232(auVar43) << 0x20);
      auVar96 = vminps_avx512vl(auVar35,auVar100);
      auVar36._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar79._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar36,local_800,auVar220);
      auVar79 = vmaxps_avx(auVar96,ZEXT1232(auVar43) << 0x20);
      auVar37._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar79._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar37,local_800,auVar220);
      auVar38._4_4_ = auVar80._4_4_ * auVar80._4_4_;
      auVar38._0_4_ = auVar80._0_4_ * auVar80._0_4_;
      auVar38._8_4_ = auVar80._8_4_ * auVar80._8_4_;
      auVar38._12_4_ = auVar80._12_4_ * auVar80._12_4_;
      auVar38._16_4_ = auVar80._16_4_ * auVar80._16_4_;
      auVar38._20_4_ = auVar80._20_4_ * auVar80._20_4_;
      auVar38._24_4_ = auVar80._24_4_ * auVar80._24_4_;
      auVar38._28_4_ = auVar80._28_4_;
      auVar79 = vsubps_avx(local_680,auVar38);
      auVar39._4_4_ = auVar79._4_4_ * (float)local_580._4_4_;
      auVar39._0_4_ = auVar79._0_4_ * (float)local_580._0_4_;
      auVar39._8_4_ = auVar79._8_4_ * fStack_578;
      auVar39._12_4_ = auVar79._12_4_ * fStack_574;
      auVar39._16_4_ = auVar79._16_4_ * fStack_570;
      auVar39._20_4_ = auVar79._20_4_ * fStack_56c;
      auVar39._24_4_ = auVar79._24_4_ * fStack_568;
      auVar39._28_4_ = auVar80._28_4_;
      auVar80 = vsubps_avx(local_7c0,auVar39);
      uVar12 = vcmpps_avx512vl(auVar80,ZEXT1232(auVar43) << 0x20,5);
      bVar55 = (byte)uVar12;
      auVar263 = ZEXT3264(local_820);
      auVar264 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_860);
      if (bVar55 == 0) {
        bVar55 = 0;
        auVar81 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar227 = ZEXT864(0) << 0x20;
        auVar80 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar253 = ZEXT864(0) << 0x20;
        auVar103._8_4_ = 0x7f800000;
        auVar103._0_8_ = 0x7f8000007f800000;
        auVar103._12_4_ = 0x7f800000;
        auVar103._16_4_ = 0x7f800000;
        auVar103._20_4_ = 0x7f800000;
        auVar103._24_4_ = 0x7f800000;
        auVar103._28_4_ = 0x7f800000;
        auVar114._8_4_ = 0xff800000;
        auVar114._0_8_ = 0xff800000ff800000;
        auVar114._12_4_ = 0xff800000;
        auVar114._16_4_ = 0xff800000;
        auVar114._20_4_ = 0xff800000;
        auVar114._24_4_ = 0xff800000;
        auVar114._28_4_ = 0xff800000;
      }
      else {
        auVar65 = vxorps_avx512vl(auVar133,auVar133);
        uVar58 = vcmpps_avx512vl(auVar80,auVar93,5);
        auVar80 = vsqrtps_avx(auVar80);
        auVar86 = vfnmadd213ps_avx512vl(local_5a0,local_5c0,auVar100);
        auVar66 = vfmadd132ps_fma(auVar86,local_5c0,local_5c0);
        auVar86 = vsubps_avx(local_5e0,auVar80);
        auVar40._4_4_ = auVar66._4_4_ * auVar86._4_4_;
        auVar40._0_4_ = auVar66._0_4_ * auVar86._0_4_;
        auVar40._8_4_ = auVar66._8_4_ * auVar86._8_4_;
        auVar40._12_4_ = auVar66._12_4_ * auVar86._12_4_;
        auVar40._16_4_ = auVar86._16_4_ * 0.0;
        auVar40._20_4_ = auVar86._20_4_ * 0.0;
        auVar40._24_4_ = auVar86._24_4_ * 0.0;
        auVar40._28_4_ = 0x3e000000;
        auVar80 = vsubps_avx512vl(auVar80,auVar103);
        auVar41._4_4_ = auVar66._4_4_ * auVar80._4_4_;
        auVar41._0_4_ = auVar66._0_4_ * auVar80._0_4_;
        auVar41._8_4_ = auVar66._8_4_ * auVar80._8_4_;
        auVar41._12_4_ = auVar66._12_4_ * auVar80._12_4_;
        auVar41._16_4_ = auVar80._16_4_ * 0.0;
        auVar41._20_4_ = auVar80._20_4_ * 0.0;
        auVar41._24_4_ = auVar80._24_4_ * 0.0;
        auVar41._28_4_ = uVar150;
        auVar80 = vfmadd213ps_avx512vl(auVar102,auVar40,auVar85);
        auVar252._0_4_ = fVar215 * auVar80._0_4_;
        auVar252._4_4_ = fVar190 * auVar80._4_4_;
        auVar252._8_4_ = fVar209 * auVar80._8_4_;
        auVar252._12_4_ = fVar210 * auVar80._12_4_;
        auVar252._16_4_ = fVar211 * auVar80._16_4_;
        auVar252._20_4_ = fVar212 * auVar80._20_4_;
        auVar252._24_4_ = fVar213 * auVar80._24_4_;
        auVar252._28_4_ = 0;
        auVar80 = vmulps_avx512vl(local_440,auVar40);
        auVar86 = vmulps_avx512vl(local_460,auVar40);
        auVar97 = vmulps_avx512vl(local_480,auVar40);
        auVar96 = vfmadd213ps_avx512vl(auVar81,auVar252,auVar87);
        auVar80 = vsubps_avx512vl(auVar80,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar82,auVar252,auVar88);
        auVar96 = vsubps_avx512vl(auVar86,auVar96);
        auVar66 = vfmadd213ps_fma(auVar252,auVar84,auVar89);
        auVar86 = vsubps_avx(auVar97,ZEXT1632(auVar66));
        auVar253 = ZEXT3264(auVar86);
        auVar85 = vfmadd213ps_avx512vl(auVar102,auVar41,auVar85);
        auVar83 = vmulps_avx512vl(auVar83,auVar85);
        auVar85 = vmulps_avx512vl(local_440,auVar41);
        auVar97 = vmulps_avx512vl(local_460,auVar41);
        auVar98 = vmulps_avx512vl(local_480,auVar41);
        auVar66 = vfmadd213ps_fma(auVar81,auVar83,auVar87);
        auVar86 = vsubps_avx(auVar85,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar82,auVar83,auVar88);
        auVar81 = vsubps_avx512vl(auVar97,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar84,auVar83,auVar89);
        auVar82 = vsubps_avx512vl(auVar98,ZEXT1632(auVar66));
        auVar227 = ZEXT3264(auVar82);
        auVar142._8_4_ = 0x7f800000;
        auVar142._0_8_ = 0x7f8000007f800000;
        auVar142._12_4_ = 0x7f800000;
        auVar142._16_4_ = 0x7f800000;
        auVar142._20_4_ = 0x7f800000;
        auVar142._24_4_ = 0x7f800000;
        auVar142._28_4_ = 0x7f800000;
        auVar82 = vblendmps_avx512vl(auVar142,auVar40);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar103._0_4_ = (uint)bVar57 * auVar82._0_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar57 * auVar82._4_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar57 * auVar82._8_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar57 * auVar82._12_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar103._16_4_ = (uint)bVar57 * auVar82._16_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar103._20_4_ = (uint)bVar57 * auVar82._20_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar103._24_4_ = (uint)bVar57 * auVar82._24_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar103._28_4_ = (uint)bVar57 * auVar82._28_4_ | (uint)!bVar57 * 0x7f800000;
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar82 = vblendmps_avx512vl(auVar187,auVar41);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar114._0_4_ = (uint)bVar57 * auVar82._0_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar57 * auVar82._4_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar57 * auVar82._8_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar57 * auVar82._12_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar57 * auVar82._16_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar57 * auVar82._20_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar57 * auVar82._24_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar114._28_4_ = (uint)bVar57 * auVar82._28_4_ | (uint)!bVar57 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar82 = vmulps_avx512vl(local_760,auVar28);
        uVar56 = vcmpps_avx512vl(auVar82,local_600,0xe);
        uVar58 = uVar58 & uVar56;
        bVar53 = (byte)uVar58;
        if (bVar53 != 0) {
          uVar56 = vcmpps_avx512vl(auVar79,ZEXT1632(auVar65),2);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar79 = vblendmps_avx512vl(auVar246,auVar258);
          bVar50 = (byte)uVar56;
          uVar59 = (uint)(bVar50 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar82._0_4_;
          bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
          uVar123 = (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * auVar82._4_4_;
          bVar57 = (bool)((byte)(uVar56 >> 2) & 1);
          uVar124 = (uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * auVar82._8_4_;
          bVar57 = (bool)((byte)(uVar56 >> 3) & 1);
          uVar125 = (uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * auVar82._12_4_;
          bVar57 = (bool)((byte)(uVar56 >> 4) & 1);
          uVar126 = (uint)bVar57 * auVar79._16_4_ | (uint)!bVar57 * auVar82._16_4_;
          bVar57 = (bool)((byte)(uVar56 >> 5) & 1);
          uVar127 = (uint)bVar57 * auVar79._20_4_ | (uint)!bVar57 * auVar82._20_4_;
          bVar57 = (bool)((byte)(uVar56 >> 6) & 1);
          uVar128 = (uint)bVar57 * auVar79._24_4_ | (uint)!bVar57 * auVar82._24_4_;
          bVar57 = SUB81(uVar56 >> 7,0);
          uVar129 = (uint)bVar57 * auVar79._28_4_ | (uint)!bVar57 * auVar82._28_4_;
          auVar103._0_4_ = (bVar53 & 1) * uVar59 | !(bool)(bVar53 & 1) * auVar103._0_4_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar103._4_4_ = bVar57 * uVar123 | !bVar57 * auVar103._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar103._8_4_ = bVar57 * uVar124 | !bVar57 * auVar103._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar103._12_4_ = bVar57 * uVar125 | !bVar57 * auVar103._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar103._16_4_ = bVar57 * uVar126 | !bVar57 * auVar103._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar103._20_4_ = bVar57 * uVar127 | !bVar57 * auVar103._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar103._24_4_ = bVar57 * uVar128 | !bVar57 * auVar103._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar103._28_4_ = bVar57 * uVar129 | !bVar57 * auVar103._28_4_;
          auVar79 = vblendmps_avx512vl(auVar258,auVar246);
          bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar56 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar56 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar56 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar56 >> 6) & 1);
          bVar9 = SUB81(uVar56 >> 7,0);
          auVar114._0_4_ =
               (uint)(bVar53 & 1) *
               ((uint)(bVar50 & 1) * auVar79._0_4_ | !(bool)(bVar50 & 1) * uVar59) |
               !(bool)(bVar53 & 1) * auVar114._0_4_;
          bVar3 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar114._4_4_ =
               (uint)bVar3 * ((uint)bVar57 * auVar79._4_4_ | !bVar57 * uVar123) |
               !bVar3 * auVar114._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar114._8_4_ =
               (uint)bVar57 * ((uint)bVar4 * auVar79._8_4_ | !bVar4 * uVar124) |
               !bVar57 * auVar114._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar114._12_4_ =
               (uint)bVar57 * ((uint)bVar5 * auVar79._12_4_ | !bVar5 * uVar125) |
               !bVar57 * auVar114._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar114._16_4_ =
               (uint)bVar57 * ((uint)bVar6 * auVar79._16_4_ | !bVar6 * uVar126) |
               !bVar57 * auVar114._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar114._20_4_ =
               (uint)bVar57 * ((uint)bVar7 * auVar79._20_4_ | !bVar7 * uVar127) |
               !bVar57 * auVar114._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar114._24_4_ =
               (uint)bVar57 * ((uint)bVar8 * auVar79._24_4_ | !bVar8 * uVar128) |
               !bVar57 * auVar114._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar114._28_4_ =
               (uint)bVar57 * ((uint)bVar9 * auVar79._28_4_ | !bVar9 * uVar129) |
               !bVar57 * auVar114._28_4_;
          bVar55 = (~bVar53 | bVar50) & bVar55;
        }
      }
      auVar247._0_4_ = local_480._0_4_ * auVar227._0_4_;
      auVar247._4_4_ = local_480._4_4_ * auVar227._4_4_;
      auVar247._8_4_ = local_480._8_4_ * auVar227._8_4_;
      auVar247._12_4_ = local_480._12_4_ * auVar227._12_4_;
      auVar247._16_4_ = local_480._16_4_ * auVar227._16_4_;
      auVar247._20_4_ = local_480._20_4_ * auVar227._20_4_;
      auVar247._28_36_ = auVar227._28_36_;
      auVar247._24_4_ = local_480._24_4_ * auVar227._24_4_;
      auVar66 = vfmadd231ps_fma(auVar247._0_32_,local_460,auVar81);
      auVar247 = ZEXT3264(local_440);
      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_440,auVar86);
      auVar241._8_4_ = 0x7fffffff;
      auVar241._0_8_ = 0x7fffffff7fffffff;
      auVar241._12_4_ = 0x7fffffff;
      auVar241._16_4_ = 0x7fffffff;
      auVar241._20_4_ = 0x7fffffff;
      auVar241._24_4_ = 0x7fffffff;
      auVar241._28_4_ = 0x7fffffff;
      auVar242 = ZEXT3264(auVar241);
      auVar79 = vandps_avx(ZEXT1632(auVar66),auVar241);
      auVar254 = ZEXT3264(local_880);
      _local_1c0 = local_880;
      auVar233._8_4_ = 0x3e99999a;
      auVar233._0_8_ = 0x3e99999a3e99999a;
      auVar233._12_4_ = 0x3e99999a;
      auVar233._16_4_ = 0x3e99999a;
      auVar233._20_4_ = 0x3e99999a;
      auVar233._24_4_ = 0x3e99999a;
      auVar233._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar79,auVar233,1);
      _local_380 = vmaxps_avx(local_880,auVar114);
      auVar79 = vminps_avx(local_360,auVar103);
      uVar14 = vcmpps_avx512vl(local_880,auVar79,2);
      bVar53 = (byte)uVar14 & bVar49;
      _local_400 = _local_380;
      uVar13 = vcmpps_avx512vl(_local_380,local_360,2);
      if ((bVar49 & ((byte)uVar13 | (byte)uVar14)) != 0) {
        auVar227 = ZEXT3264(local_880);
        local_890 = (uint)(byte)((byte)uVar12 | ~bVar55);
        auVar42._4_4_ = local_480._4_4_ * auVar253._4_4_;
        auVar42._0_4_ = local_480._0_4_ * auVar253._0_4_;
        auVar42._8_4_ = local_480._8_4_ * auVar253._8_4_;
        auVar42._12_4_ = local_480._12_4_ * auVar253._12_4_;
        auVar42._16_4_ = local_480._16_4_ * auVar253._16_4_;
        auVar42._20_4_ = local_480._20_4_ * auVar253._20_4_;
        auVar42._24_4_ = local_480._24_4_ * auVar253._24_4_;
        auVar42._28_4_ = auVar79._28_4_;
        auVar66 = vfmadd213ps_fma(auVar96,local_460,auVar42);
        auVar66 = vfmadd213ps_fma(auVar80,local_440,ZEXT1632(auVar66));
        auVar79 = vandps_avx(ZEXT1632(auVar66),auVar241);
        uVar12 = vcmpps_avx512vl(auVar79,auVar233,1);
        bVar55 = (byte)uVar12 | ~bVar55;
        auVar143._8_4_ = 2;
        auVar143._0_8_ = 0x200000002;
        auVar143._12_4_ = 2;
        auVar143._16_4_ = 2;
        auVar143._20_4_ = 2;
        auVar143._24_4_ = 2;
        auVar143._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar143,auVar29);
        local_340._0_4_ = (uint)(bVar55 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar57 = (bool)(bVar55 >> 1 & 1);
        local_340._4_4_ = (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar55 >> 2 & 1);
        local_340._8_4_ = (uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar55 >> 3 & 1);
        local_340._12_4_ = (uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar55 >> 4 & 1);
        local_340._16_4_ = (uint)bVar57 * auVar79._16_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar55 >> 5 & 1);
        local_340._20_4_ = (uint)bVar57 * auVar79._20_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar55 >> 6 & 1);
        local_340._24_4_ = (uint)bVar57 * auVar79._24_4_ | (uint)!bVar57 * 2;
        local_340._28_4_ = (uint)(bVar55 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_3a0,local_340,5);
        local_88c = (uint)bVar53;
        local_3e0 = local_880._0_4_ + (float)local_420._0_4_;
        fStack_3dc = local_880._4_4_ + (float)local_420._4_4_;
        fStack_3d8 = local_880._8_4_ + fStack_418;
        fStack_3d4 = local_880._12_4_ + fStack_414;
        fStack_3d0 = local_880._16_4_ + fStack_410;
        fStack_3cc = local_880._20_4_ + fStack_40c;
        fStack_3c8 = local_880._24_4_ + fStack_408;
        fStack_3c4 = local_880._28_4_ + fStack_404;
        for (bVar53 = (byte)uVar12 & bVar53; bVar53 != 0; bVar53 = ~bVar55 & bVar53 & (byte)uVar12)
        {
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar79 = vblendmps_avx512vl(auVar144,auVar227._0_32_);
          auVar115._0_4_ =
               (uint)(bVar53 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar115._4_4_ = (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar115._8_4_ = (uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar115._12_4_ = (uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar115._16_4_ = (uint)bVar57 * auVar79._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar115._20_4_ = (uint)bVar57 * auVar79._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar115._24_4_ =
               (uint)(bVar53 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar115._28_4_ = 0x7f800000;
          auVar79 = vshufps_avx(auVar115,auVar115,0xb1);
          auVar79 = vminps_avx(auVar115,auVar79);
          auVar80 = vshufpd_avx(auVar79,auVar79,5);
          auVar79 = vminps_avx(auVar79,auVar80);
          auVar80 = vpermpd_avx2(auVar79,0x4e);
          auVar79 = vminps_avx(auVar79,auVar80);
          uVar12 = vcmpps_avx512vl(auVar115,auVar79,0);
          bVar50 = (byte)uVar12 & bVar53;
          bVar55 = bVar53;
          if (bVar50 != 0) {
            bVar55 = bVar50;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar55; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar55 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_1e0 + (uint)(iVar15 << 2));
          auVar242 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
          fVar215 = local_888;
          if ((float)local_720._0_4_ < 0.0) {
            local_800._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar215 = sqrtf((float)local_720._0_4_);
            auVar242 = ZEXT1664(local_800._0_16_);
            auVar265 = ZEXT3264(local_860);
            auVar264 = ZEXT3264(local_840);
            auVar263 = ZEXT3264(local_820);
          }
          uVar58 = (ulong)bVar55;
          auVar65 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar66 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar60 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar10 = vminps_avx(auVar65,auVar60);
          auVar65 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar60 = vmaxps_avx(auVar66,auVar65);
          auVar194._8_4_ = 0x7fffffff;
          auVar194._0_8_ = 0x7fffffff7fffffff;
          auVar194._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar10,auVar194);
          auVar65 = vandps_avx(auVar60,auVar194);
          auVar66 = vmaxps_avx(auVar66,auVar65);
          auVar65 = vmovshdup_avx(auVar66);
          auVar65 = vmaxss_avx(auVar65,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar65);
          fVar190 = auVar66._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar60,auVar60,0xff);
          auVar66 = vinsertps_avx(auVar242._0_16_,ZEXT416(uVar59),0x10);
          uVar56 = 0;
          while( true ) {
            bVar50 = (byte)uVar58;
            if (uVar56 == 5) break;
            uVar150 = auVar66._0_4_;
            auVar134._4_4_ = uVar150;
            auVar134._0_4_ = uVar150;
            auVar134._8_4_ = uVar150;
            auVar134._12_4_ = uVar150;
            auVar65 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_710);
            auVar60 = vmovshdup_avx(auVar66);
            fVar234 = auVar60._0_4_;
            fVar214 = 1.0 - fVar234;
            fVar209 = fVar234 * fVar234;
            auVar69 = SUB6416(ZEXT464(0x40400000),0);
            auVar68 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar67 = vfmadd213ss_fma(auVar69,auVar60,auVar68);
            auVar10 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar209),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar61 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar214),auVar68);
            auVar61 = vfmadd213ss_fma(auVar61,ZEXT416((uint)(fVar214 * fVar214)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar210 = fVar214 * fVar214 * -fVar234 * 0.5;
            fVar211 = auVar10._0_4_ * 0.5;
            fVar212 = auVar61._0_4_ * 0.5;
            fVar213 = fVar234 * fVar234 * -fVar214 * 0.5;
            auVar195._0_4_ = fVar213 * (float)local_700._0_4_;
            auVar195._4_4_ = fVar213 * (float)local_700._4_4_;
            auVar195._8_4_ = fVar213 * fStack_6f8;
            auVar195._12_4_ = fVar213 * fStack_6f4;
            auVar218._4_4_ = fVar212;
            auVar218._0_4_ = fVar212;
            auVar218._8_4_ = fVar212;
            auVar218._12_4_ = fVar212;
            auVar10 = vfmadd132ps_fma(auVar218,auVar195,local_6c0._0_16_);
            auVar171._4_4_ = fVar211;
            auVar171._0_4_ = fVar211;
            auVar171._8_4_ = fVar211;
            auVar171._12_4_ = fVar211;
            auVar10 = vfmadd132ps_fma(auVar171,auVar10,local_6e0._0_16_);
            auVar196._4_4_ = fVar210;
            auVar196._0_4_ = fVar210;
            auVar196._8_4_ = fVar210;
            auVar196._12_4_ = fVar210;
            auVar10 = vfmadd132ps_fma(auVar196,auVar10,local_6a0._0_16_);
            auVar61 = vfmadd231ss_fma(auVar68,auVar60,ZEXT416(0x41100000));
            local_5a0._0_16_ = auVar61;
            auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar60,ZEXT416(0x40800000));
            local_5c0._0_16_ = auVar61;
            auVar61 = vfmadd213ss_fma(auVar69,auVar60,ZEXT416(0xbf800000));
            local_5e0._0_16_ = auVar61;
            _local_580 = auVar10;
            auVar10 = vsubps_avx(auVar65,auVar10);
            auVar65 = vdpps_avx(auVar10,auVar10,0x7f);
            local_800._0_16_ = auVar65;
            local_680._0_16_ = auVar66;
            if (auVar65._0_4_ < 0.0) {
              local_7c0._0_4_ = auVar67._0_4_;
              local_7e0._0_16_ = ZEXT416((uint)fVar214);
              local_740._0_4_ = fVar209;
              local_760._0_4_ = fVar214 * -2.0;
              auVar253._0_4_ = sqrtf(auVar65._0_4_);
              auVar253._4_60_ = extraout_var;
              auVar67 = ZEXT416((uint)local_7c0._0_4_);
              auVar66 = auVar253._0_16_;
              uVar58 = extraout_RAX;
              auVar65 = local_7e0._0_16_;
            }
            else {
              auVar66 = vsqrtss_avx(auVar65,auVar65);
              local_760._0_4_ = fVar214 * -2.0;
              local_740._0_4_ = fVar209;
              auVar65 = ZEXT416((uint)fVar214);
            }
            fVar209 = auVar65._0_4_;
            auVar68 = vfnmadd231ss_fma(ZEXT416((uint)(fVar234 * (fVar209 + fVar209))),auVar65,
                                       auVar65);
            auVar65 = vfmadd213ss_fma(auVar67,ZEXT416((uint)(fVar234 + fVar234)),
                                      ZEXT416((uint)(fVar234 * fVar234 * 3.0)));
            auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar60,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                      ZEXT416((uint)(fVar209 + fVar209)),auVar67);
            auVar67 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar60,
                                      ZEXT416((uint)local_740._0_4_));
            fVar209 = auVar68._0_4_ * 0.5;
            fVar210 = auVar65._0_4_ * 0.5;
            fVar211 = auVar61._0_4_ * 0.5;
            fVar212 = auVar67._0_4_ * 0.5;
            auVar197._0_4_ = fVar212 * (float)local_700._0_4_;
            auVar197._4_4_ = fVar212 * (float)local_700._4_4_;
            auVar197._8_4_ = fVar212 * fStack_6f8;
            auVar197._12_4_ = fVar212 * fStack_6f4;
            auVar172._4_4_ = fVar211;
            auVar172._0_4_ = fVar211;
            auVar172._8_4_ = fVar211;
            auVar172._12_4_ = fVar211;
            auVar65 = vfmadd132ps_fma(auVar172,auVar197,local_6c0._0_16_);
            auVar153._4_4_ = fVar210;
            auVar153._0_4_ = fVar210;
            auVar153._8_4_ = fVar210;
            auVar153._12_4_ = fVar210;
            auVar65 = vfmadd132ps_fma(auVar153,auVar65,local_6e0._0_16_);
            auVar256._4_4_ = fVar209;
            auVar256._0_4_ = fVar209;
            auVar256._8_4_ = fVar209;
            auVar256._12_4_ = fVar209;
            local_7c0._0_16_ = vfmadd132ps_fma(auVar256,auVar65,local_6a0._0_16_);
            local_740._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
            auVar44._12_4_ = 0;
            auVar44._0_12_ = ZEXT812(0);
            fVar209 = local_740._0_4_;
            auVar65 = vrsqrt14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar209));
            fVar210 = auVar65._0_4_;
            local_760._0_16_ = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar209));
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar67 = vxorps_avx512vl(local_740._0_16_,auVar17);
            auVar65 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_600._0_4_ = auVar65._0_4_;
            local_7e0._0_4_ = auVar66._0_4_;
            if (fVar209 < auVar67._0_4_) {
              fVar211 = sqrtf(fVar209);
              auVar66 = ZEXT416((uint)local_7e0._0_4_);
              uVar58 = extraout_RAX_00;
              auVar65 = local_7c0._0_16_;
            }
            else {
              auVar65 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
              fVar211 = auVar65._0_4_;
              auVar65 = local_7c0._0_16_;
            }
            fVar209 = fVar210 * 1.5 + fVar209 * -0.5 * fVar210 * fVar210 * fVar210;
            auVar135._0_4_ = auVar65._0_4_ * fVar209;
            auVar135._4_4_ = auVar65._4_4_ * fVar209;
            auVar135._8_4_ = auVar65._8_4_ * fVar209;
            auVar135._12_4_ = auVar65._12_4_ * fVar209;
            auVar67 = vdpps_avx(auVar10,auVar135,0x7f);
            fVar213 = auVar66._0_4_;
            fVar210 = auVar67._0_4_;
            auVar136._0_4_ = fVar210 * fVar210;
            auVar136._4_4_ = auVar67._4_4_ * auVar67._4_4_;
            auVar136._8_4_ = auVar67._8_4_ * auVar67._8_4_;
            auVar136._12_4_ = auVar67._12_4_ * auVar67._12_4_;
            auVar61 = vsubps_avx512vl(local_800._0_16_,auVar136);
            fVar212 = auVar61._0_4_;
            auVar154._4_12_ = ZEXT812(0) << 0x20;
            auVar154._0_4_ = fVar212;
            auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
            auVar69 = vmulss_avx512f(auVar61,ZEXT416(0xbf000000));
            if (fVar212 < 0.0) {
              local_630 = fVar209;
              fStack_62c = fVar209;
              fStack_628 = fVar209;
              fStack_624 = fVar209;
              local_620 = auVar68;
              fVar212 = sqrtf(fVar212);
              auVar69 = ZEXT416(auVar69._0_4_);
              auVar66 = ZEXT416((uint)local_7e0._0_4_);
              uVar58 = extraout_RAX_01;
              auVar61 = local_620;
              auVar65 = local_7c0._0_16_;
              fVar209 = local_630;
              fVar214 = fStack_62c;
              fVar234 = fStack_628;
              fVar235 = fStack_624;
            }
            else {
              auVar61 = vsqrtss_avx(auVar61,auVar61);
              fVar212 = auVar61._0_4_;
              auVar61 = auVar68;
              fVar214 = fVar209;
              fVar234 = fVar209;
              fVar235 = fVar209;
            }
            auVar253 = ZEXT1664(auVar10);
            auVar263 = ZEXT3264(local_820);
            auVar264 = ZEXT3264(local_840);
            auVar265 = ZEXT3264(local_860);
            auVar155._0_4_ = (float)local_5e0._0_4_ * (float)local_700._0_4_;
            auVar155._4_4_ = (float)local_5e0._0_4_ * (float)local_700._4_4_;
            auVar155._8_4_ = (float)local_5e0._0_4_ * fStack_6f8;
            auVar155._12_4_ = (float)local_5e0._0_4_ * fStack_6f4;
            auVar173._4_4_ = local_5c0._0_4_;
            auVar173._0_4_ = local_5c0._0_4_;
            auVar173._8_4_ = local_5c0._0_4_;
            auVar173._12_4_ = local_5c0._0_4_;
            auVar62 = vfmadd132ps_fma(auVar173,auVar155,local_6c0._0_16_);
            auVar156._4_4_ = local_5a0._0_4_;
            auVar156._0_4_ = local_5a0._0_4_;
            auVar156._8_4_ = local_5a0._0_4_;
            auVar156._12_4_ = local_5a0._0_4_;
            auVar62 = vfmadd132ps_fma(auVar156,auVar62,local_6e0._0_16_);
            auVar60 = vfmadd213ss_fma(auVar60,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar150 = auVar60._0_4_;
            auVar174._4_4_ = uVar150;
            auVar174._0_4_ = uVar150;
            auVar174._8_4_ = uVar150;
            auVar174._12_4_ = uVar150;
            auVar60 = vfmadd132ps_fma(auVar174,auVar62,local_6a0._0_16_);
            auVar157._0_4_ = auVar60._0_4_ * (float)local_740._0_4_;
            auVar157._4_4_ = auVar60._4_4_ * (float)local_740._0_4_;
            auVar157._8_4_ = auVar60._8_4_ * (float)local_740._0_4_;
            auVar157._12_4_ = auVar60._12_4_ * (float)local_740._0_4_;
            auVar60 = vdpps_avx(auVar65,auVar60,0x7f);
            fVar169 = auVar60._0_4_;
            auVar175._0_4_ = auVar65._0_4_ * fVar169;
            auVar175._4_4_ = auVar65._4_4_ * fVar169;
            auVar175._8_4_ = auVar65._8_4_ * fVar169;
            auVar175._12_4_ = auVar65._12_4_ * fVar169;
            auVar60 = vsubps_avx(auVar157,auVar175);
            fVar169 = (float)local_600._0_4_ * (float)local_760._0_4_;
            auVar62 = vmaxss_avx(ZEXT416((uint)fVar190),
                                 ZEXT416((uint)(local_680._0_4_ * fVar215 * 1.9073486e-06)));
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar117._16_16_ = local_860._16_16_;
            auVar70 = vxorps_avx512vl(auVar65,auVar18);
            auVar176._0_4_ = fVar209 * auVar60._0_4_ * fVar169;
            auVar176._4_4_ = fVar214 * auVar60._4_4_ * fVar169;
            auVar176._8_4_ = fVar234 * auVar60._8_4_ * fVar169;
            auVar176._12_4_ = fVar235 * auVar60._12_4_ * fVar169;
            auVar254 = ZEXT1664(auVar135);
            auVar60 = vdpps_avx(auVar70,auVar135,0x7f);
            auVar11 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar190),auVar62);
            auVar66 = vdpps_avx(auVar10,auVar176,0x7f);
            auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                      ZEXT416((uint)(fVar190 / fVar211)),auVar11);
            fVar209 = auVar60._0_4_ + auVar66._0_4_;
            auVar66 = vdpps_avx(local_710,auVar135,0x7f);
            auVar60 = vdpps_avx(auVar10,auVar70,0x7f);
            auVar69 = vmulss_avx512f(auVar69,auVar61);
            fVar211 = auVar68._0_4_ * 1.5 + auVar69._0_4_ * auVar61._0_4_ * auVar61._0_4_;
            auVar61 = vdpps_avx(auVar10,local_710,0x7f);
            auVar69 = vfnmadd231ss_fma(auVar60,auVar67,ZEXT416((uint)fVar209));
            auVar61 = vfnmadd231ss_fma(auVar61,auVar67,auVar66);
            auVar60 = vpermilps_avx(_local_580,0xff);
            fVar212 = fVar212 - auVar60._0_4_;
            auVar68 = vshufps_avx(auVar65,auVar65,0xff);
            auVar60 = vfmsub213ss_fma(auVar69,ZEXT416((uint)fVar211),auVar68);
            auVar244._8_4_ = 0x80000000;
            auVar244._0_8_ = 0x8000000080000000;
            auVar244._12_4_ = 0x80000000;
            auVar247 = ZEXT1664(auVar244);
            auVar239._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar239._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar239._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar242 = ZEXT1664(auVar239);
            auVar61 = ZEXT416((uint)(auVar61._0_4_ * fVar211));
            auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar60._0_4_)),
                                      ZEXT416((uint)fVar209),auVar61);
            auVar60 = vinsertps_avx(auVar239,auVar61,0x1c);
            auVar223._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar223._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar223._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar61 = vinsertps_avx(ZEXT416((uint)fVar209),auVar223,0x10);
            auVar198._0_4_ = auVar69._0_4_;
            auVar198._4_4_ = auVar198._0_4_;
            auVar198._8_4_ = auVar198._0_4_;
            auVar198._12_4_ = auVar198._0_4_;
            auVar66 = vdivps_avx(auVar60,auVar198);
            auVar60 = vdivps_avx(auVar61,auVar198);
            auVar199._0_4_ = fVar210 * auVar66._0_4_ + fVar212 * auVar60._0_4_;
            auVar199._4_4_ = fVar210 * auVar66._4_4_ + fVar212 * auVar60._4_4_;
            auVar199._8_4_ = fVar210 * auVar66._8_4_ + fVar212 * auVar60._8_4_;
            auVar199._12_4_ = fVar210 * auVar66._12_4_ + fVar212 * auVar60._12_4_;
            auVar66 = vsubps_avx(local_680._0_16_,auVar199);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar60 = vandps_avx512vl(auVar67,auVar19);
            if (auVar60._0_4_ < auVar11._0_4_) {
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar62._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx512vl(ZEXT416((uint)fVar212),auVar20);
              if (auVar67._0_4_ < auVar60._0_4_) {
                bVar57 = uVar56 < 5;
                fVar215 = auVar66._0_4_ + (float)local_650._0_4_;
                if ((fVar149 <= fVar215) &&
                   (fVar190 = *(float *)(ray + k * 4 + 0x80), fVar215 <= fVar190)) {
                  auVar60 = vmovshdup_avx(auVar66);
                  bVar50 = 0;
                  if ((auVar60._0_4_ < 0.0) || (1.0 < auVar60._0_4_)) goto LAB_017f1021;
                  auVar200._0_12_ = ZEXT812(0);
                  auVar200._12_4_ = 0;
                  auVar117._0_16_ = auVar200;
                  auVar116._4_28_ = auVar117._4_28_;
                  auVar116._0_4_ = local_800._0_4_;
                  auVar60 = vrsqrt14ss_avx512f(auVar200,auVar116._0_16_);
                  fVar209 = auVar60._0_4_;
                  auVar60 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                  pGVar1 = (context->scene->geometries).items[local_898].ptr;
                  if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar50 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017f1021;
                    fVar209 = fVar209 * 1.5 + auVar60._0_4_ * fVar209 * fVar209 * fVar209;
                    auVar177._0_4_ = auVar10._0_4_ * fVar209;
                    auVar177._4_4_ = auVar10._4_4_ * fVar209;
                    auVar177._8_4_ = auVar10._8_4_ * fVar209;
                    auVar177._12_4_ = auVar10._12_4_ * fVar209;
                    auVar61 = vfmadd213ps_fma(auVar68,auVar177,auVar65);
                    auVar60 = vshufps_avx(auVar177,auVar177,0xc9);
                    auVar67 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar178._0_4_ = auVar177._0_4_ * auVar67._0_4_;
                    auVar178._4_4_ = auVar177._4_4_ * auVar67._4_4_;
                    auVar178._8_4_ = auVar177._8_4_ * auVar67._8_4_;
                    auVar178._12_4_ = auVar177._12_4_ * auVar67._12_4_;
                    auVar67 = vfmsub231ps_fma(auVar178,auVar65,auVar60);
                    auVar65 = vshufps_avx(auVar67,auVar67,0xc9);
                    auVar60 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar67 = vshufps_avx(auVar67,auVar67,0xd2);
                    auVar137._0_4_ = auVar61._0_4_ * auVar67._0_4_;
                    auVar137._4_4_ = auVar61._4_4_ * auVar67._4_4_;
                    auVar137._8_4_ = auVar61._8_4_ * auVar67._8_4_;
                    auVar137._12_4_ = auVar61._12_4_ * auVar67._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar137,auVar65,auVar60);
                    local_4f0 = vshufps_avx(auVar66,auVar66,0x55);
                    local_520 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                    auStack_510 = vshufps_avx(auVar65,auVar65,0xaa);
                    local_500 = auVar65._0_4_;
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    local_4e0 = ZEXT416(0) << 0x20;
                    local_4d0 = local_530._0_8_;
                    uStack_4c8 = local_530._8_8_;
                    local_4c0 = local_540;
                    vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                    uStack_4ac = context->user->instID[0];
                    local_4b0 = uStack_4ac;
                    uStack_4a8 = uStack_4ac;
                    uStack_4a4 = uStack_4ac;
                    uStack_4a0 = context->user->instPrimID[0];
                    uStack_49c = uStack_4a0;
                    uStack_498 = uStack_4a0;
                    uStack_494 = uStack_4a0;
                    *(float *)(ray + k * 4 + 0x80) = fVar215;
                    local_8b0 = local_550;
                    local_790.valid = (int *)local_8b0;
                    local_790.geometryUserPtr = pGVar1->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_520;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar242 = ZEXT1664(auVar239);
                      auVar247 = ZEXT1664(auVar244);
                      auVar253 = ZEXT1664(auVar10);
                      auVar254 = ZEXT1664(auVar135);
                      (*pGVar1->occlusionFilterN)(&local_790);
                      auVar265 = ZEXT3264(local_860);
                      auVar264 = ZEXT3264(local_840);
                      auVar263 = ZEXT3264(local_820);
                    }
                    uVar58 = vptestmd_avx512vl(local_8b0,local_8b0);
                    if ((uVar58 & 0xf) == 0) {
                      auVar227 = ZEXT3264(local_880);
                    }
                    else {
                      p_Var2 = context->args->filter;
                      if (p_Var2 == (RTCFilterFunctionN)0x0) {
                        auVar227 = ZEXT3264(local_880);
                      }
                      else {
                        auVar227 = ZEXT3264(local_880);
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar1->field_8).field_0x2 & 0x40) != 0)) {
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          (*p_Var2)(&local_790);
                          auVar227 = ZEXT3264(local_880);
                          auVar265 = ZEXT3264(local_860);
                          auVar264 = ZEXT3264(local_840);
                          auVar263 = ZEXT3264(local_820);
                        }
                      }
                      uVar58 = vptestmd_avx512vl(local_8b0,local_8b0);
                      uVar58 = uVar58 & 0xf;
                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar3 = (bool)((byte)uVar58 & 1);
                      bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar58 >> 2) & 1);
                      bVar6 = SUB81(uVar58 >> 3,0);
                      *(uint *)(local_790.ray + 0x80) =
                           (uint)bVar3 * auVar66._0_4_ |
                           (uint)!bVar3 * *(int *)(local_790.ray + 0x80);
                      *(uint *)(local_790.ray + 0x84) =
                           (uint)bVar4 * auVar66._4_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x84);
                      *(uint *)(local_790.ray + 0x88) =
                           (uint)bVar5 * auVar66._8_4_ |
                           (uint)!bVar5 * *(int *)(local_790.ray + 0x88);
                      *(uint *)(local_790.ray + 0x8c) =
                           (uint)bVar6 * auVar66._12_4_ |
                           (uint)!bVar6 * *(int *)(local_790.ray + 0x8c);
                      bVar50 = 1;
                      if ((byte)uVar58 != 0) goto LAB_017f102a;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar190;
                    bVar50 = 0;
                    goto LAB_017f102a;
                  }
                }
                bVar50 = 0;
                goto LAB_017f1021;
              }
            }
            uVar56 = uVar56 + 1;
          }
          bVar57 = false;
LAB_017f1021:
          auVar227 = ZEXT3264(local_880);
LAB_017f102a:
          bVar51 = bVar51 | bVar57 & bVar50;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar225._4_4_ = uVar150;
          auVar225._0_4_ = uVar150;
          auVar225._8_4_ = uVar150;
          auVar225._12_4_ = uVar150;
          auVar225._16_4_ = uVar150;
          auVar225._20_4_ = uVar150;
          auVar225._24_4_ = uVar150;
          auVar225._28_4_ = uVar150;
          auVar168 = ZEXT3264(auVar225);
          auVar46._4_4_ = fStack_3dc;
          auVar46._0_4_ = local_3e0;
          auVar46._8_4_ = fStack_3d8;
          auVar46._12_4_ = fStack_3d4;
          auVar46._16_4_ = fStack_3d0;
          auVar46._20_4_ = fStack_3cc;
          auVar46._24_4_ = fStack_3c8;
          auVar46._28_4_ = fStack_3c4;
          uVar12 = vcmpps_avx512vl(auVar225,auVar46,0xd);
        }
        auVar145._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
        auVar145._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
        auVar145._8_4_ = fStack_418 + fStack_3f8;
        auVar145._12_4_ = fStack_414 + fStack_3f4;
        auVar145._16_4_ = fStack_410 + fStack_3f0;
        auVar145._20_4_ = fStack_40c + fStack_3ec;
        auVar145._24_4_ = fStack_408 + fStack_3e8;
        auVar145._28_4_ = fStack_404 + fStack_3e4;
        uVar150 = auVar168._0_4_;
        auVar164._4_4_ = uVar150;
        auVar164._0_4_ = uVar150;
        auVar164._8_4_ = uVar150;
        auVar164._12_4_ = uVar150;
        auVar164._16_4_ = uVar150;
        auVar164._20_4_ = uVar150;
        auVar164._24_4_ = uVar150;
        auVar164._28_4_ = uVar150;
        uVar12 = vcmpps_avx512vl(auVar145,auVar164,2);
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar146,auVar30);
        bVar57 = (bool)((byte)local_890 & 1);
        local_400._0_4_ = (uint)bVar57 * auVar79._0_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)((byte)(local_890 >> 1) & 1);
        local_400._4_4_ = (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)((byte)(local_890 >> 2) & 1);
        fStack_3f8 = (float)((uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 3) & 1);
        fStack_3f4 = (float)((uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 4) & 1);
        fStack_3f0 = (float)((uint)bVar57 * auVar79._16_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 5) & 1);
        fStack_3ec = (float)((uint)bVar57 * auVar79._20_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 6) & 1);
        fStack_3e8 = (float)((uint)bVar57 * auVar79._24_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 7) & 1);
        fStack_3e4 = (float)((uint)bVar57 * auVar79._28_4_ | (uint)!bVar57 * 2);
        bVar49 = (byte)uVar13 & bVar49 & (byte)uVar12;
        uVar12 = vpcmpd_avx512vl(_local_400,local_3a0,2);
        local_880 = _local_380;
        local_3e0 = (float)local_420._0_4_ + (float)local_380._0_4_;
        fStack_3dc = (float)local_420._4_4_ + (float)local_380._4_4_;
        fStack_3d8 = fStack_418 + fStack_378;
        fStack_3d4 = fStack_414 + fStack_374;
        fStack_3d0 = fStack_410 + fStack_370;
        fStack_3cc = fStack_40c + fStack_36c;
        fStack_3c8 = fStack_408 + fStack_368;
        fStack_3c4 = fStack_404 + fStack_364;
        for (bVar55 = (byte)uVar12 & bVar49; bVar55 != 0; bVar55 = ~bVar53 & bVar55 & (byte)uVar12)
        {
          auVar147._8_4_ = 0x7f800000;
          auVar147._0_8_ = 0x7f8000007f800000;
          auVar147._12_4_ = 0x7f800000;
          auVar147._16_4_ = 0x7f800000;
          auVar147._20_4_ = 0x7f800000;
          auVar147._24_4_ = 0x7f800000;
          auVar147._28_4_ = 0x7f800000;
          auVar79 = vblendmps_avx512vl(auVar147,local_880);
          auVar118._0_4_ =
               (uint)(bVar55 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar55 >> 1 & 1);
          auVar118._4_4_ = (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar55 >> 2 & 1);
          auVar118._8_4_ = (uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar55 >> 3 & 1);
          auVar118._12_4_ = (uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar55 >> 4 & 1);
          auVar118._16_4_ = (uint)bVar57 * auVar79._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar55 >> 5 & 1);
          auVar118._20_4_ = (uint)bVar57 * auVar79._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar118._24_4_ =
               (uint)(bVar55 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar55 >> 6) * 0x7f800000;
          auVar118._28_4_ = 0x7f800000;
          auVar79 = vshufps_avx(auVar118,auVar118,0xb1);
          auVar79 = vminps_avx(auVar118,auVar79);
          auVar80 = vshufpd_avx(auVar79,auVar79,5);
          auVar79 = vminps_avx(auVar79,auVar80);
          auVar80 = vpermpd_avx2(auVar79,0x4e);
          auVar79 = vminps_avx(auVar79,auVar80);
          uVar12 = vcmpps_avx512vl(auVar118,auVar79,0);
          bVar50 = (byte)uVar12 & bVar55;
          bVar53 = bVar55;
          if (bVar50 != 0) {
            bVar53 = bVar50;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar53; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar53 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_200 + (uint)(iVar15 << 2));
          auVar242 = ZEXT464(*(uint *)(local_360 + (uint)(iVar15 << 2)));
          fVar215 = local_884;
          if ((float)local_720._0_4_ < 0.0) {
            local_800._0_16_ = ZEXT416(*(uint *)(local_360 + (uint)(iVar15 << 2)));
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar215 = sqrtf((float)local_720._0_4_);
            auVar242 = ZEXT1664(local_800._0_16_);
            auVar265 = ZEXT3264(local_860);
            auVar264 = ZEXT3264(local_840);
            auVar263 = ZEXT3264(local_820);
          }
          uVar58 = (ulong)bVar53;
          auVar65 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar66 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar60 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar10 = vminps_avx(auVar65,auVar60);
          auVar65 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar60 = vmaxps_avx(auVar66,auVar65);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar10,auVar201);
          auVar65 = vandps_avx(auVar60,auVar201);
          auVar66 = vmaxps_avx(auVar66,auVar65);
          auVar65 = vmovshdup_avx(auVar66);
          auVar65 = vmaxss_avx(auVar65,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar65);
          fVar190 = auVar66._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar60,auVar60,0xff);
          auVar66 = vinsertps_avx(auVar242._0_16_,ZEXT416(uVar59),0x10);
          uVar56 = 0;
          while( true ) {
            bVar50 = (byte)uVar58;
            if (uVar56 == 5) break;
            uVar150 = auVar66._0_4_;
            auVar138._4_4_ = uVar150;
            auVar138._0_4_ = uVar150;
            auVar138._8_4_ = uVar150;
            auVar138._12_4_ = uVar150;
            auVar65 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_710);
            auVar60 = vmovshdup_avx(auVar66);
            fVar234 = auVar60._0_4_;
            fVar214 = 1.0 - fVar234;
            fVar209 = fVar234 * fVar234;
            auVar69 = SUB6416(ZEXT464(0x40400000),0);
            auVar68 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar67 = vfmadd213ss_fma(auVar69,auVar60,auVar68);
            auVar10 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar209),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar61 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar214),auVar68);
            auVar61 = vfmadd213ss_fma(auVar61,ZEXT416((uint)(fVar214 * fVar214)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar210 = fVar214 * fVar214 * -fVar234 * 0.5;
            fVar211 = auVar10._0_4_ * 0.5;
            fVar212 = auVar61._0_4_ * 0.5;
            fVar213 = fVar234 * fVar234 * -fVar214 * 0.5;
            auVar202._0_4_ = fVar213 * (float)local_700._0_4_;
            auVar202._4_4_ = fVar213 * (float)local_700._4_4_;
            auVar202._8_4_ = fVar213 * fStack_6f8;
            auVar202._12_4_ = fVar213 * fStack_6f4;
            auVar219._4_4_ = fVar212;
            auVar219._0_4_ = fVar212;
            auVar219._8_4_ = fVar212;
            auVar219._12_4_ = fVar212;
            auVar10 = vfmadd132ps_fma(auVar219,auVar202,local_6c0._0_16_);
            auVar179._4_4_ = fVar211;
            auVar179._0_4_ = fVar211;
            auVar179._8_4_ = fVar211;
            auVar179._12_4_ = fVar211;
            auVar10 = vfmadd132ps_fma(auVar179,auVar10,local_6e0._0_16_);
            auVar203._4_4_ = fVar210;
            auVar203._0_4_ = fVar210;
            auVar203._8_4_ = fVar210;
            auVar203._12_4_ = fVar210;
            auVar10 = vfmadd132ps_fma(auVar203,auVar10,local_6a0._0_16_);
            auVar61 = vfmadd231ss_fma(auVar68,auVar60,ZEXT416(0x41100000));
            local_5a0._0_16_ = auVar61;
            auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar60,ZEXT416(0x40800000));
            local_5c0._0_16_ = auVar61;
            auVar61 = vfmadd213ss_fma(auVar69,auVar60,ZEXT416(0xbf800000));
            local_5e0._0_16_ = auVar61;
            _local_580 = auVar10;
            auVar10 = vsubps_avx(auVar65,auVar10);
            auVar65 = vdpps_avx(auVar10,auVar10,0x7f);
            local_800._0_16_ = auVar65;
            local_680._0_16_ = auVar66;
            if (auVar65._0_4_ < 0.0) {
              local_7c0._0_4_ = auVar67._0_4_;
              local_7e0._0_16_ = ZEXT416((uint)fVar214);
              local_740._0_4_ = fVar209;
              local_760._0_4_ = fVar214 * -2.0;
              auVar254._0_4_ = sqrtf(auVar65._0_4_);
              auVar254._4_60_ = extraout_var_00;
              auVar67 = ZEXT416((uint)local_7c0._0_4_);
              auVar66 = auVar254._0_16_;
              uVar58 = extraout_RAX_02;
              auVar65 = local_7e0._0_16_;
            }
            else {
              auVar66 = vsqrtss_avx(auVar65,auVar65);
              local_760._0_4_ = fVar214 * -2.0;
              local_740._0_4_ = fVar209;
              auVar65 = ZEXT416((uint)fVar214);
            }
            fVar209 = auVar65._0_4_;
            auVar68 = vfnmadd231ss_fma(ZEXT416((uint)(fVar234 * (fVar209 + fVar209))),auVar65,
                                       auVar65);
            auVar65 = vfmadd213ss_fma(auVar67,ZEXT416((uint)(fVar234 + fVar234)),
                                      ZEXT416((uint)(fVar234 * fVar234 * 3.0)));
            auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar60,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                      ZEXT416((uint)(fVar209 + fVar209)),auVar67);
            auVar67 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar60,
                                      ZEXT416((uint)local_740._0_4_));
            fVar209 = auVar68._0_4_ * 0.5;
            fVar210 = auVar65._0_4_ * 0.5;
            fVar211 = auVar61._0_4_ * 0.5;
            fVar212 = auVar67._0_4_ * 0.5;
            auVar204._0_4_ = fVar212 * (float)local_700._0_4_;
            auVar204._4_4_ = fVar212 * (float)local_700._4_4_;
            auVar204._8_4_ = fVar212 * fStack_6f8;
            auVar204._12_4_ = fVar212 * fStack_6f4;
            auVar180._4_4_ = fVar211;
            auVar180._0_4_ = fVar211;
            auVar180._8_4_ = fVar211;
            auVar180._12_4_ = fVar211;
            auVar65 = vfmadd132ps_fma(auVar180,auVar204,local_6c0._0_16_);
            auVar158._4_4_ = fVar210;
            auVar158._0_4_ = fVar210;
            auVar158._8_4_ = fVar210;
            auVar158._12_4_ = fVar210;
            auVar65 = vfmadd132ps_fma(auVar158,auVar65,local_6e0._0_16_);
            auVar257._4_4_ = fVar209;
            auVar257._0_4_ = fVar209;
            auVar257._8_4_ = fVar209;
            auVar257._12_4_ = fVar209;
            local_7c0._0_16_ = vfmadd132ps_fma(auVar257,auVar65,local_6a0._0_16_);
            local_740._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
            auVar45._12_4_ = 0;
            auVar45._0_12_ = ZEXT812(0);
            fVar209 = local_740._0_4_;
            auVar65 = vrsqrt14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar209));
            fVar210 = auVar65._0_4_;
            local_760._0_16_ = vrcp14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar209));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar67 = vxorps_avx512vl(local_740._0_16_,auVar21);
            auVar65 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_600._0_4_ = auVar65._0_4_;
            local_7e0._0_4_ = auVar66._0_4_;
            if (fVar209 < auVar67._0_4_) {
              fVar211 = sqrtf(fVar209);
              auVar66 = ZEXT416((uint)local_7e0._0_4_);
              uVar58 = extraout_RAX_03;
              auVar65 = local_7c0._0_16_;
            }
            else {
              auVar65 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
              fVar211 = auVar65._0_4_;
              auVar65 = local_7c0._0_16_;
            }
            fVar209 = fVar210 * 1.5 + fVar209 * -0.5 * fVar210 * fVar210 * fVar210;
            auVar139._0_4_ = auVar65._0_4_ * fVar209;
            auVar139._4_4_ = auVar65._4_4_ * fVar209;
            auVar139._8_4_ = auVar65._8_4_ * fVar209;
            auVar139._12_4_ = auVar65._12_4_ * fVar209;
            auVar67 = vdpps_avx(auVar10,auVar139,0x7f);
            fVar213 = auVar66._0_4_;
            fVar210 = auVar67._0_4_;
            auVar140._0_4_ = fVar210 * fVar210;
            auVar140._4_4_ = auVar67._4_4_ * auVar67._4_4_;
            auVar140._8_4_ = auVar67._8_4_ * auVar67._8_4_;
            auVar140._12_4_ = auVar67._12_4_ * auVar67._12_4_;
            auVar61 = vsubps_avx512vl(local_800._0_16_,auVar140);
            fVar212 = auVar61._0_4_;
            auVar159._4_12_ = ZEXT812(0) << 0x20;
            auVar159._0_4_ = fVar212;
            auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
            auVar69 = vmulss_avx512f(auVar61,ZEXT416(0xbf000000));
            if (fVar212 < 0.0) {
              local_630 = fVar209;
              fStack_62c = fVar209;
              fStack_628 = fVar209;
              fStack_624 = fVar209;
              local_620 = auVar68;
              fVar212 = sqrtf(fVar212);
              auVar69 = ZEXT416(auVar69._0_4_);
              auVar66 = ZEXT416((uint)local_7e0._0_4_);
              uVar58 = extraout_RAX_04;
              auVar61 = local_620;
              auVar65 = local_7c0._0_16_;
              fVar209 = local_630;
              fVar214 = fStack_62c;
              fVar234 = fStack_628;
              fVar235 = fStack_624;
            }
            else {
              auVar61 = vsqrtss_avx(auVar61,auVar61);
              fVar212 = auVar61._0_4_;
              auVar61 = auVar68;
              fVar214 = fVar209;
              fVar234 = fVar209;
              fVar235 = fVar209;
            }
            auVar253 = ZEXT1664(auVar10);
            auVar263 = ZEXT3264(local_820);
            auVar264 = ZEXT3264(local_840);
            auVar265 = ZEXT3264(local_860);
            auVar160._0_4_ = (float)local_5e0._0_4_ * (float)local_700._0_4_;
            auVar160._4_4_ = (float)local_5e0._0_4_ * (float)local_700._4_4_;
            auVar160._8_4_ = (float)local_5e0._0_4_ * fStack_6f8;
            auVar160._12_4_ = (float)local_5e0._0_4_ * fStack_6f4;
            auVar181._4_4_ = local_5c0._0_4_;
            auVar181._0_4_ = local_5c0._0_4_;
            auVar181._8_4_ = local_5c0._0_4_;
            auVar181._12_4_ = local_5c0._0_4_;
            auVar62 = vfmadd132ps_fma(auVar181,auVar160,local_6c0._0_16_);
            auVar161._4_4_ = local_5a0._0_4_;
            auVar161._0_4_ = local_5a0._0_4_;
            auVar161._8_4_ = local_5a0._0_4_;
            auVar161._12_4_ = local_5a0._0_4_;
            auVar62 = vfmadd132ps_fma(auVar161,auVar62,local_6e0._0_16_);
            auVar60 = vfmadd213ss_fma(auVar60,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar150 = auVar60._0_4_;
            auVar182._4_4_ = uVar150;
            auVar182._0_4_ = uVar150;
            auVar182._8_4_ = uVar150;
            auVar182._12_4_ = uVar150;
            auVar60 = vfmadd132ps_fma(auVar182,auVar62,local_6a0._0_16_);
            auVar162._0_4_ = auVar60._0_4_ * (float)local_740._0_4_;
            auVar162._4_4_ = auVar60._4_4_ * (float)local_740._0_4_;
            auVar162._8_4_ = auVar60._8_4_ * (float)local_740._0_4_;
            auVar162._12_4_ = auVar60._12_4_ * (float)local_740._0_4_;
            auVar60 = vdpps_avx(auVar65,auVar60,0x7f);
            fVar169 = auVar60._0_4_;
            auVar183._0_4_ = auVar65._0_4_ * fVar169;
            auVar183._4_4_ = auVar65._4_4_ * fVar169;
            auVar183._8_4_ = auVar65._8_4_ * fVar169;
            auVar183._12_4_ = auVar65._12_4_ * fVar169;
            auVar60 = vsubps_avx(auVar162,auVar183);
            fVar169 = (float)local_600._0_4_ * (float)local_760._0_4_;
            auVar62 = vmaxss_avx(ZEXT416((uint)fVar190),
                                 ZEXT416((uint)(local_680._0_4_ * fVar215 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar120._16_16_ = local_860._16_16_;
            auVar70 = vxorps_avx512vl(auVar65,auVar22);
            auVar184._0_4_ = fVar209 * auVar60._0_4_ * fVar169;
            auVar184._4_4_ = fVar214 * auVar60._4_4_ * fVar169;
            auVar184._8_4_ = fVar234 * auVar60._8_4_ * fVar169;
            auVar184._12_4_ = fVar235 * auVar60._12_4_ * fVar169;
            auVar254 = ZEXT1664(auVar139);
            auVar60 = vdpps_avx(auVar70,auVar139,0x7f);
            auVar11 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar190),auVar62);
            auVar66 = vdpps_avx(auVar10,auVar184,0x7f);
            auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                      ZEXT416((uint)(fVar190 / fVar211)),auVar11);
            fVar209 = auVar60._0_4_ + auVar66._0_4_;
            auVar66 = vdpps_avx(local_710,auVar139,0x7f);
            auVar60 = vdpps_avx(auVar10,auVar70,0x7f);
            auVar69 = vmulss_avx512f(auVar69,auVar61);
            fVar211 = auVar68._0_4_ * 1.5 + auVar69._0_4_ * auVar61._0_4_ * auVar61._0_4_;
            auVar61 = vdpps_avx(auVar10,local_710,0x7f);
            auVar69 = vfnmadd231ss_fma(auVar60,auVar67,ZEXT416((uint)fVar209));
            auVar61 = vfnmadd231ss_fma(auVar61,auVar67,auVar66);
            auVar60 = vpermilps_avx(_local_580,0xff);
            fVar212 = fVar212 - auVar60._0_4_;
            auVar68 = vshufps_avx(auVar65,auVar65,0xff);
            auVar60 = vfmsub213ss_fma(auVar69,ZEXT416((uint)fVar211),auVar68);
            auVar245._8_4_ = 0x80000000;
            auVar245._0_8_ = 0x8000000080000000;
            auVar245._12_4_ = 0x80000000;
            auVar247 = ZEXT1664(auVar245);
            auVar240._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar240._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar240._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar242 = ZEXT1664(auVar240);
            auVar61 = ZEXT416((uint)(auVar61._0_4_ * fVar211));
            auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar60._0_4_)),
                                      ZEXT416((uint)fVar209),auVar61);
            auVar60 = vinsertps_avx(auVar240,auVar61,0x1c);
            auVar224._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar224._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar224._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar61 = vinsertps_avx(ZEXT416((uint)fVar209),auVar224,0x10);
            auVar205._0_4_ = auVar69._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar66 = vdivps_avx(auVar60,auVar205);
            auVar60 = vdivps_avx(auVar61,auVar205);
            auVar206._0_4_ = fVar210 * auVar66._0_4_ + fVar212 * auVar60._0_4_;
            auVar206._4_4_ = fVar210 * auVar66._4_4_ + fVar212 * auVar60._4_4_;
            auVar206._8_4_ = fVar210 * auVar66._8_4_ + fVar212 * auVar60._8_4_;
            auVar206._12_4_ = fVar210 * auVar66._12_4_ + fVar212 * auVar60._12_4_;
            auVar66 = vsubps_avx(local_680._0_16_,auVar206);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar60 = vandps_avx512vl(auVar67,auVar23);
            if (auVar60._0_4_ < auVar11._0_4_) {
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar62._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx512vl(ZEXT416((uint)fVar212),auVar24);
              if (auVar67._0_4_ < auVar60._0_4_) {
                bVar57 = uVar56 < 5;
                fVar215 = auVar66._0_4_ + (float)local_650._0_4_;
                if ((fVar149 <= fVar215) &&
                   (fVar190 = *(float *)(ray + k * 4 + 0x80), fVar215 <= fVar190)) {
                  auVar60 = vmovshdup_avx(auVar66);
                  bVar50 = 0;
                  if ((auVar60._0_4_ < 0.0) || (1.0 < auVar60._0_4_)) goto LAB_017f1c88;
                  auVar207._0_12_ = ZEXT812(0);
                  auVar207._12_4_ = 0;
                  auVar120._0_16_ = auVar207;
                  auVar119._4_28_ = auVar120._4_28_;
                  auVar119._0_4_ = local_800._0_4_;
                  auVar60 = vrsqrt14ss_avx512f(auVar207,auVar119._0_16_);
                  fVar209 = auVar60._0_4_;
                  auVar60 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                  pGVar1 = (context->scene->geometries).items[local_898].ptr;
                  if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar50 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017f1c88;
                    fVar209 = fVar209 * 1.5 + auVar60._0_4_ * fVar209 * fVar209 * fVar209;
                    auVar185._0_4_ = auVar10._0_4_ * fVar209;
                    auVar185._4_4_ = auVar10._4_4_ * fVar209;
                    auVar185._8_4_ = auVar10._8_4_ * fVar209;
                    auVar185._12_4_ = auVar10._12_4_ * fVar209;
                    auVar61 = vfmadd213ps_fma(auVar68,auVar185,auVar65);
                    auVar60 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar67 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar186._0_4_ = auVar185._0_4_ * auVar67._0_4_;
                    auVar186._4_4_ = auVar185._4_4_ * auVar67._4_4_;
                    auVar186._8_4_ = auVar185._8_4_ * auVar67._8_4_;
                    auVar186._12_4_ = auVar185._12_4_ * auVar67._12_4_;
                    auVar67 = vfmsub231ps_fma(auVar186,auVar65,auVar60);
                    auVar65 = vshufps_avx(auVar67,auVar67,0xc9);
                    auVar60 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar67 = vshufps_avx(auVar67,auVar67,0xd2);
                    auVar141._0_4_ = auVar61._0_4_ * auVar67._0_4_;
                    auVar141._4_4_ = auVar61._4_4_ * auVar67._4_4_;
                    auVar141._8_4_ = auVar61._8_4_ * auVar67._8_4_;
                    auVar141._12_4_ = auVar61._12_4_ * auVar67._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar141,auVar65,auVar60);
                    local_4f0 = vshufps_avx(auVar66,auVar66,0x55);
                    local_520 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                    auStack_510 = vshufps_avx(auVar65,auVar65,0xaa);
                    local_500 = auVar65._0_4_;
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    local_4e0 = ZEXT416(0) << 0x20;
                    local_4d0 = local_530._0_8_;
                    uStack_4c8 = local_530._8_8_;
                    local_4c0 = local_540;
                    vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                    uStack_4ac = context->user->instID[0];
                    local_4b0 = uStack_4ac;
                    uStack_4a8 = uStack_4ac;
                    uStack_4a4 = uStack_4ac;
                    uStack_4a0 = context->user->instPrimID[0];
                    uStack_49c = uStack_4a0;
                    uStack_498 = uStack_4a0;
                    uStack_494 = uStack_4a0;
                    *(float *)(ray + k * 4 + 0x80) = fVar215;
                    local_8b0 = local_550;
                    local_790.valid = (int *)local_8b0;
                    local_790.geometryUserPtr = pGVar1->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_520;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar242 = ZEXT1664(auVar240);
                      auVar247 = ZEXT1664(auVar245);
                      auVar253 = ZEXT1664(auVar10);
                      auVar254 = ZEXT1664(auVar139);
                      (*pGVar1->occlusionFilterN)(&local_790);
                      auVar265 = ZEXT3264(local_860);
                      auVar264 = ZEXT3264(local_840);
                      auVar263 = ZEXT3264(local_820);
                    }
                    uVar58 = vptestmd_avx512vl(local_8b0,local_8b0);
                    if ((uVar58 & 0xf) != 0) {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar254 = ZEXT1664(auVar254._0_16_);
                        (*p_Var2)(&local_790);
                        auVar265 = ZEXT3264(local_860);
                        auVar264 = ZEXT3264(local_840);
                        auVar263 = ZEXT3264(local_820);
                      }
                      uVar58 = vptestmd_avx512vl(local_8b0,local_8b0);
                      uVar58 = uVar58 & 0xf;
                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar3 = (bool)((byte)uVar58 & 1);
                      auVar71._0_4_ =
                           (uint)bVar3 * auVar66._0_4_ |
                           (uint)!bVar3 * *(int *)(local_790.ray + 0x80);
                      bVar3 = (bool)((byte)(uVar58 >> 1) & 1);
                      auVar71._4_4_ =
                           (uint)bVar3 * auVar66._4_4_ |
                           (uint)!bVar3 * *(int *)(local_790.ray + 0x84);
                      bVar3 = (bool)((byte)(uVar58 >> 2) & 1);
                      auVar71._8_4_ =
                           (uint)bVar3 * auVar66._8_4_ |
                           (uint)!bVar3 * *(int *)(local_790.ray + 0x88);
                      bVar3 = SUB81(uVar58 >> 3,0);
                      auVar71._12_4_ =
                           (uint)bVar3 * auVar66._12_4_ |
                           (uint)!bVar3 * *(int *)(local_790.ray + 0x8c);
                      *(undefined1 (*) [16])(local_790.ray + 0x80) = auVar71;
                      bVar50 = 1;
                      if ((byte)uVar58 != 0) goto LAB_017f1c88;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar190;
                  }
                }
                bVar50 = 0;
                goto LAB_017f1c88;
              }
            }
            uVar56 = uVar56 + 1;
          }
          bVar57 = false;
LAB_017f1c88:
          bVar51 = bVar51 | bVar57 & bVar50;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar226._4_4_ = uVar150;
          auVar226._0_4_ = uVar150;
          auVar226._8_4_ = uVar150;
          auVar226._12_4_ = uVar150;
          auVar226._16_4_ = uVar150;
          auVar226._20_4_ = uVar150;
          auVar226._24_4_ = uVar150;
          auVar226._28_4_ = uVar150;
          auVar168 = ZEXT3264(auVar226);
          auVar47._4_4_ = fStack_3dc;
          auVar47._0_4_ = local_3e0;
          auVar47._8_4_ = fStack_3d8;
          auVar47._12_4_ = fStack_3d4;
          auVar47._16_4_ = fStack_3d0;
          auVar47._20_4_ = fStack_3cc;
          auVar47._24_4_ = fStack_3c8;
          auVar47._28_4_ = fStack_3c4;
          uVar12 = vcmpps_avx512vl(auVar226,auVar47,0xd);
        }
        uVar14 = vpcmpd_avx512vl(local_3a0,local_340,1);
        uVar13 = vpcmpd_avx512vl(local_3a0,_local_400,1);
        auVar165._0_4_ = (float)local_420._0_4_ + (float)local_1c0._0_4_;
        auVar165._4_4_ = (float)local_420._4_4_ + (float)local_1c0._4_4_;
        auVar165._8_4_ = fStack_418 + fStack_1b8;
        auVar165._12_4_ = fStack_414 + fStack_1b4;
        auVar165._16_4_ = fStack_410 + fStack_1b0;
        auVar165._20_4_ = fStack_40c + fStack_1ac;
        auVar165._24_4_ = fStack_408 + fStack_1a8;
        auVar165._28_4_ = fStack_404 + fStack_1a4;
        uVar150 = auVar168._0_4_;
        auVar188._4_4_ = uVar150;
        auVar188._0_4_ = uVar150;
        auVar188._8_4_ = uVar150;
        auVar188._12_4_ = uVar150;
        auVar188._16_4_ = uVar150;
        auVar188._20_4_ = uVar150;
        auVar188._24_4_ = uVar150;
        auVar188._28_4_ = uVar150;
        uVar12 = vcmpps_avx512vl(auVar165,auVar188,2);
        bVar55 = (byte)local_88c & (byte)uVar14 & (byte)uVar12;
        auVar208._0_4_ = (float)local_420._0_4_ + (float)local_380._0_4_;
        auVar208._4_4_ = (float)local_420._4_4_ + (float)local_380._4_4_;
        auVar208._8_4_ = fStack_418 + fStack_378;
        auVar208._12_4_ = fStack_414 + fStack_374;
        auVar208._16_4_ = fStack_410 + fStack_370;
        auVar208._20_4_ = fStack_40c + fStack_36c;
        auVar208._24_4_ = fStack_408 + fStack_368;
        auVar208._28_4_ = fStack_404 + fStack_364;
        uVar12 = vcmpps_avx512vl(auVar208,auVar188,2);
        bVar49 = bVar49 & (byte)uVar13 & (byte)uVar12 | bVar55;
        prim = local_7a0;
        if (bVar49 != 0) {
          abStack_180[uVar54 * 0x60] = bVar49;
          auVar121._0_4_ =
               (uint)(bVar55 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar55 & 1) * local_380._0_4_;
          bVar57 = (bool)(bVar55 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar57 * local_1c0._4_4_ | (uint)!bVar57 * local_380._4_4_;
          bVar57 = (bool)(bVar55 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar57 * (int)fStack_1b8 | (uint)!bVar57 * (int)fStack_378;
          bVar57 = (bool)(bVar55 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar57 * (int)fStack_1b4 | (uint)!bVar57 * (int)fStack_374;
          bVar57 = (bool)(bVar55 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar57 * (int)fStack_1b0 | (uint)!bVar57 * (int)fStack_370;
          bVar57 = (bool)(bVar55 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar57 * (int)fStack_1ac | (uint)!bVar57 * (int)fStack_36c;
          bVar57 = (bool)(bVar55 >> 6 & 1);
          auVar121._24_4_ = (uint)bVar57 * (int)fStack_1a8 | (uint)!bVar57 * (int)fStack_368;
          auVar121._28_4_ =
               (uint)(bVar55 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar55 >> 7) * (int)fStack_364;
          *(undefined1 (*) [32])(auStack_160 + uVar54 * 0x60) = auVar121;
          uVar58 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar54 * 0xc] = uVar58;
          aiStack_138[uVar54 * 0x18] = local_a28 + 1;
          uVar54 = (ulong)((int)uVar54 + 1);
        }
      }
      auVar227 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar59 = (uint)uVar54;
      uVar54 = (ulong)(uVar59 - 1);
      if (uVar59 == 0) {
        if (bVar51 != 0) goto LAB_017f224b;
        uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar25._4_4_ = uVar150;
        auVar25._0_4_ = uVar150;
        auVar25._8_4_ = uVar150;
        auVar25._12_4_ = uVar150;
        uVar12 = vcmpps_avx512vl(local_3c0,auVar25,2);
        local_798 = (ulong)((uint)local_608 & (uint)uVar12);
        goto LAB_017ef8a6;
      }
      lVar52 = uVar54 * 0x60;
      auVar79 = *(undefined1 (*) [32])(auStack_160 + lVar52);
      auVar166._0_4_ = auVar79._0_4_ + (float)local_420._0_4_;
      auVar166._4_4_ = auVar79._4_4_ + (float)local_420._4_4_;
      auVar166._8_4_ = auVar79._8_4_ + fStack_418;
      auVar166._12_4_ = auVar79._12_4_ + fStack_414;
      auVar166._16_4_ = auVar79._16_4_ + fStack_410;
      auVar166._20_4_ = auVar79._20_4_ + fStack_40c;
      auVar166._24_4_ = auVar79._24_4_ + fStack_408;
      auVar166._28_4_ = auVar79._28_4_ + fStack_404;
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar150;
      auVar31._0_4_ = uVar150;
      auVar31._8_4_ = uVar150;
      auVar31._12_4_ = uVar150;
      auVar31._16_4_ = uVar150;
      auVar31._20_4_ = uVar150;
      auVar31._24_4_ = uVar150;
      auVar31._28_4_ = uVar150;
      uVar12 = vcmpps_avx512vl(auVar166,auVar31,2);
      uVar123 = (uint)uVar12 & (uint)abStack_180[lVar52];
    } while (uVar123 == 0);
    uVar58 = (&uStack_140)[uVar54 * 0xc];
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar58;
    auVar189._8_4_ = 0x7f800000;
    auVar189._0_8_ = 0x7f8000007f800000;
    auVar189._12_4_ = 0x7f800000;
    auVar189._16_4_ = 0x7f800000;
    auVar189._20_4_ = 0x7f800000;
    auVar189._24_4_ = 0x7f800000;
    auVar189._28_4_ = 0x7f800000;
    auVar80 = vblendmps_avx512vl(auVar189,auVar79);
    bVar49 = (byte)uVar123;
    auVar122._0_4_ =
         (uint)(bVar49 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar49 & 1) * (int)auVar79._0_4_;
    bVar57 = (bool)((byte)(uVar123 >> 1) & 1);
    auVar122._4_4_ = (uint)bVar57 * auVar80._4_4_ | (uint)!bVar57 * (int)auVar79._4_4_;
    bVar57 = (bool)((byte)(uVar123 >> 2) & 1);
    auVar122._8_4_ = (uint)bVar57 * auVar80._8_4_ | (uint)!bVar57 * (int)auVar79._8_4_;
    bVar57 = (bool)((byte)(uVar123 >> 3) & 1);
    auVar122._12_4_ = (uint)bVar57 * auVar80._12_4_ | (uint)!bVar57 * (int)auVar79._12_4_;
    bVar57 = (bool)((byte)(uVar123 >> 4) & 1);
    auVar122._16_4_ = (uint)bVar57 * auVar80._16_4_ | (uint)!bVar57 * (int)auVar79._16_4_;
    bVar57 = (bool)((byte)(uVar123 >> 5) & 1);
    auVar122._20_4_ = (uint)bVar57 * auVar80._20_4_ | (uint)!bVar57 * (int)auVar79._20_4_;
    bVar57 = (bool)((byte)(uVar123 >> 6) & 1);
    auVar122._24_4_ = (uint)bVar57 * auVar80._24_4_ | (uint)!bVar57 * (int)auVar79._24_4_;
    auVar122._28_4_ =
         (uVar123 >> 7) * auVar80._28_4_ | (uint)!SUB41(uVar123 >> 7,0) * (int)auVar79._28_4_;
    auVar79 = vshufps_avx(auVar122,auVar122,0xb1);
    auVar79 = vminps_avx(auVar122,auVar79);
    auVar80 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vminps_avx(auVar79,auVar80);
    auVar80 = vpermpd_avx2(auVar79,0x4e);
    auVar79 = vminps_avx(auVar79,auVar80);
    uVar12 = vcmpps_avx512vl(auVar122,auVar79,0);
    bVar55 = (byte)uVar12 & bVar49;
    if (bVar55 != 0) {
      uVar123 = (uint)bVar55;
    }
    uVar124 = 0;
    for (; (uVar123 & 1) == 0; uVar123 = uVar123 >> 1 | 0x80000000) {
      uVar124 = uVar124 + 1;
    }
    local_a28 = aiStack_138[uVar54 * 0x18];
    bVar49 = ~('\x01' << ((byte)uVar124 & 0x1f)) & bVar49;
    abStack_180[lVar52] = bVar49;
    if (bVar49 == 0) {
      uVar59 = uVar59 - 1;
    }
    uVar150 = (undefined4)uVar58;
    auVar148._4_4_ = uVar150;
    auVar148._0_4_ = uVar150;
    auVar148._8_4_ = uVar150;
    auVar148._12_4_ = uVar150;
    auVar148._16_4_ = uVar150;
    auVar148._20_4_ = uVar150;
    auVar148._24_4_ = uVar150;
    auVar148._28_4_ = uVar150;
    auVar66 = vmovshdup_avx(auVar163);
    auVar66 = vsubps_avx(auVar66,auVar163);
    auVar167._0_4_ = auVar66._0_4_;
    auVar167._4_4_ = auVar167._0_4_;
    auVar167._8_4_ = auVar167._0_4_;
    auVar167._12_4_ = auVar167._0_4_;
    auVar167._16_4_ = auVar167._0_4_;
    auVar167._20_4_ = auVar167._0_4_;
    auVar167._24_4_ = auVar167._0_4_;
    auVar167._28_4_ = auVar167._0_4_;
    auVar66 = vfmadd132ps_fma(auVar167,auVar148,auVar227._0_32_);
    _local_520 = ZEXT1632(auVar66);
    auVar168 = ZEXT864(*(ulong *)(local_520 + (ulong)uVar124 * 4));
    uVar54 = (ulong)uVar59;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }